

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_h<embree::avx512::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  ulong uVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  long lVar75;
  bool bVar76;
  ulong uVar77;
  uint uVar78;
  undefined1 auVar89 [16];
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar156;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar150 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 extraout_var [60];
  undefined1 auVar153 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  undefined4 uVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [64];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar214 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined4 uVar227;
  undefined4 uVar228;
  float fVar229;
  undefined1 auVar226 [28];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_88c;
  ulong local_888;
  undefined1 local_880 [32];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  ulong local_7c8;
  RTCFilterFunctionNArguments local_7c0;
  uint local_78c;
  uint local_788;
  undefined4 local_784;
  undefined1 local_780 [16];
  undefined8 local_770;
  float local_768;
  float local_764;
  undefined4 local_760;
  uint local_75c;
  uint local_758;
  uint local_754;
  uint local_750;
  Primitive *local_738;
  ulong local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar121 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar4 = prim[1];
  uVar73 = (ulong)(byte)PVar4;
  fVar211 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar87 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar191 = fVar211 * auVar87._0_4_;
  fVar135 = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar81);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar79);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar102 = vpmovsxbd_avx2(auVar83);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar102);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar73 + 6);
  auVar94 = vpmovsxbd_avx2(auVar88);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar77 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar99 = vpmovsxbd_avx2(auVar3);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 + uVar73 + 6);
  auVar100 = vpmovsxbd_avx2(auVar84);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar71 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar92 = vpmovsxbd_avx2(auVar85);
  auVar101 = vcvtdq2ps_avx(auVar92);
  auVar113._4_4_ = fVar135;
  auVar113._0_4_ = fVar135;
  auVar113._8_4_ = fVar135;
  auVar113._12_4_ = fVar135;
  auVar113._16_4_ = fVar135;
  auVar113._20_4_ = fVar135;
  auVar113._24_4_ = fVar135;
  auVar113._28_4_ = fVar135;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = ZEXT1632(CONCAT412(fVar211 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar211 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar211 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar135))));
  auVar103 = vpermps_avx2(auVar117,auVar104);
  auVar91 = vpermps_avx512vl(auVar90,auVar104);
  fVar135 = auVar91._0_4_;
  fVar215 = auVar91._4_4_;
  auVar104._4_4_ = fVar215 * auVar96._4_4_;
  auVar104._0_4_ = fVar135 * auVar96._0_4_;
  fVar216 = auVar91._8_4_;
  auVar104._8_4_ = fVar216 * auVar96._8_4_;
  fVar229 = auVar91._12_4_;
  auVar104._12_4_ = fVar229 * auVar96._12_4_;
  fVar156 = auVar91._16_4_;
  auVar104._16_4_ = fVar156 * auVar96._16_4_;
  fVar217 = auVar91._20_4_;
  auVar104._20_4_ = fVar217 * auVar96._20_4_;
  fVar218 = auVar91._24_4_;
  auVar104._24_4_ = fVar218 * auVar96._24_4_;
  auVar104._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar94._4_4_ * fVar215;
  auVar102._0_4_ = auVar94._0_4_ * fVar135;
  auVar102._8_4_ = auVar94._8_4_ * fVar216;
  auVar102._12_4_ = auVar94._12_4_ * fVar229;
  auVar102._16_4_ = auVar94._16_4_ * fVar156;
  auVar102._20_4_ = auVar94._20_4_ * fVar217;
  auVar102._24_4_ = auVar94._24_4_ * fVar218;
  auVar102._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar101._4_4_ * fVar215;
  auVar92._0_4_ = auVar101._0_4_ * fVar135;
  auVar92._8_4_ = auVar101._8_4_ * fVar216;
  auVar92._12_4_ = auVar101._12_4_ * fVar229;
  auVar92._16_4_ = auVar101._16_4_ * fVar156;
  auVar92._20_4_ = auVar101._20_4_ * fVar217;
  auVar92._24_4_ = auVar101._24_4_ * fVar218;
  auVar92._28_4_ = auVar91._28_4_;
  auVar80 = vfmadd231ps_fma(auVar104,auVar103,auVar95);
  auVar81 = vfmadd231ps_fma(auVar102,auVar103,auVar98);
  auVar79 = vfmadd231ps_fma(auVar92,auVar100,auVar103);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar113,auVar93);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar97);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,auVar113);
  auVar114._4_4_ = fVar191;
  auVar114._0_4_ = fVar191;
  auVar114._8_4_ = fVar191;
  auVar114._12_4_ = fVar191;
  auVar114._16_4_ = fVar191;
  auVar114._20_4_ = fVar191;
  auVar114._24_4_ = fVar191;
  auVar114._28_4_ = fVar191;
  auVar92 = ZEXT1632(CONCAT412(fVar211 * auVar87._12_4_,
                               CONCAT48(fVar211 * auVar87._8_4_,
                                        CONCAT44(fVar211 * auVar87._4_4_,fVar191))));
  auVar102 = vpermps_avx2(auVar117,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar211 = auVar92._0_4_;
  fVar135 = auVar92._4_4_;
  auVar103._4_4_ = fVar135 * auVar96._4_4_;
  auVar103._0_4_ = fVar211 * auVar96._0_4_;
  fVar215 = auVar92._8_4_;
  auVar103._8_4_ = fVar215 * auVar96._8_4_;
  fVar216 = auVar92._12_4_;
  auVar103._12_4_ = fVar216 * auVar96._12_4_;
  fVar229 = auVar92._16_4_;
  auVar103._16_4_ = fVar229 * auVar96._16_4_;
  fVar156 = auVar92._20_4_;
  auVar103._20_4_ = fVar156 * auVar96._20_4_;
  fVar217 = auVar92._24_4_;
  auVar103._24_4_ = fVar217 * auVar96._24_4_;
  auVar103._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar135;
  auVar90._0_4_ = auVar94._0_4_ * fVar211;
  auVar90._8_4_ = auVar94._8_4_ * fVar215;
  auVar90._12_4_ = auVar94._12_4_ * fVar216;
  auVar90._16_4_ = auVar94._16_4_ * fVar229;
  auVar90._20_4_ = auVar94._20_4_ * fVar156;
  auVar90._24_4_ = auVar94._24_4_ * fVar217;
  auVar90._28_4_ = auVar96._28_4_;
  auVar94._4_4_ = auVar101._4_4_ * fVar135;
  auVar94._0_4_ = auVar101._0_4_ * fVar211;
  auVar94._8_4_ = auVar101._8_4_ * fVar215;
  auVar94._12_4_ = auVar101._12_4_ * fVar216;
  auVar94._16_4_ = auVar101._16_4_ * fVar229;
  auVar94._20_4_ = auVar101._20_4_ * fVar156;
  auVar94._24_4_ = auVar101._24_4_ * fVar217;
  auVar94._28_4_ = auVar92._28_4_;
  auVar82 = vfmadd231ps_fma(auVar103,auVar102,auVar95);
  auVar83 = vfmadd231ps_fma(auVar90,auVar102,auVar98);
  auVar88 = vfmadd231ps_fma(auVar94,auVar102,auVar100);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar114,auVar93);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,auVar97);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar114,auVar99);
  auVar93 = vandps_avx(ZEXT1632(auVar80),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar93,auVar112,1);
  bVar8 = (bool)((byte)uVar77 & 1);
  auVar91._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._0_4_;
  bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._4_4_;
  bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._8_4_;
  bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar81),auVar110);
  uVar77 = vcmpps_avx512vl(auVar93,auVar112,1);
  bVar8 = (bool)((byte)uVar77 & 1);
  auVar105._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar81._0_4_;
  bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar81._4_4_;
  bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar81._8_4_;
  bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar81._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar79),auVar110);
  uVar77 = vcmpps_avx512vl(auVar93,auVar112,1);
  bVar8 = (bool)((byte)uVar77 & 1);
  auVar106._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar79._0_4_;
  bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar79._4_4_;
  bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar79._8_4_;
  bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar79._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar91,auVar93,auVar111);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar105);
  auVar81 = vfnmadd213ps_fma(auVar105,auVar93,auVar111);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar106);
  auVar79 = vfnmadd213ps_fma(auVar106,auVar93,auVar111);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar93,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar99._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar99._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar99._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar94 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar109._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar109._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar109._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar109._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar109._16_4_ = auVar93._16_4_ * 0.0;
  auVar109._20_4_ = auVar93._20_4_ * 0.0;
  auVar109._24_4_ = auVar93._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar73 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar83));
  auVar100._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar100._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar100._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar100._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * 0.0;
  auVar100._20_4_ = auVar93._20_4_ * 0.0;
  auVar100._24_4_ = auVar93._24_4_ * 0.0;
  auVar100._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar95);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar83));
  auVar108._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar108._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar108._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar108._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar108._16_4_ = auVar93._16_4_ * 0.0;
  auVar108._20_4_ = auVar93._20_4_ * 0.0;
  auVar108._24_4_ = auVar93._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + uVar73 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar88));
  auVar101._4_4_ = auVar93._4_4_ * auVar79._4_4_;
  auVar101._0_4_ = auVar93._0_4_ * auVar79._0_4_;
  auVar101._8_4_ = auVar93._8_4_ * auVar79._8_4_;
  auVar101._12_4_ = auVar93._12_4_ * auVar79._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar88));
  auVar107._0_4_ = auVar79._0_4_ * auVar93._0_4_;
  auVar107._4_4_ = auVar79._4_4_ * auVar93._4_4_;
  auVar107._8_4_ = auVar79._8_4_ * auVar93._8_4_;
  auVar107._12_4_ = auVar79._12_4_ * auVar93._12_4_;
  auVar107._16_4_ = auVar93._16_4_ * 0.0;
  auVar107._20_4_ = auVar93._20_4_ * 0.0;
  auVar107._24_4_ = auVar93._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar99,auVar109);
  auVar95 = vpminsd_avx2(auVar100,auVar108);
  auVar93 = vmaxps_avx(auVar93,auVar95);
  auVar95 = vpminsd_avx2(auVar101,auVar107);
  uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar96._4_4_ = uVar206;
  auVar96._0_4_ = uVar206;
  auVar96._8_4_ = uVar206;
  auVar96._12_4_ = uVar206;
  auVar96._16_4_ = uVar206;
  auVar96._20_4_ = uVar206;
  auVar96._24_4_ = uVar206;
  auVar96._28_4_ = uVar206;
  auVar95 = vmaxps_avx512vl(auVar95,auVar96);
  auVar93 = vmaxps_avx(auVar93,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar93,auVar95);
  auVar93 = vpmaxsd_avx2(auVar99,auVar109);
  auVar95 = vpmaxsd_avx2(auVar100,auVar108);
  auVar93 = vminps_avx(auVar93,auVar95);
  auVar95 = vpmaxsd_avx2(auVar101,auVar107);
  fVar211 = (ray->super_RayK<1>).tfar;
  auVar97._4_4_ = fVar211;
  auVar97._0_4_ = fVar211;
  auVar97._8_4_ = fVar211;
  auVar97._12_4_ = fVar211;
  auVar97._16_4_ = fVar211;
  auVar97._20_4_ = fVar211;
  auVar97._24_4_ = fVar211;
  auVar97._28_4_ = fVar211;
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar93 = vminps_avx(auVar93,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar98);
  uVar17 = vpcmpgtd_avx512vl(auVar94,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_3c0,auVar93,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return;
  }
  local_728 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  auVar234 = ZEXT864(0) << 0x20;
  local_738 = prim;
LAB_01d6e96e:
  lVar75 = 0;
  for (uVar77 = local_728; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  local_888 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_848 = (ulong)*(uint *)(prim + lVar75 * 4 + 6);
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(prim + lVar75 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar80 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar77);
  auVar81 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * (uVar77 + 1));
  auVar86._8_4_ = 0xbeaaaaab;
  auVar86._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar86._12_4_ = 0xbeaaaaab;
  auVar88 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              uVar77 * (long)pGVar5[2].pointQueryFunc),auVar80,auVar86);
  auVar83 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar5[2].intersectionFilterN +
                             (long)pGVar5[2].pointQueryFunc * (uVar77 + 1)),auVar81,auVar86);
  auVar89._0_4_ = auVar81._0_4_ + auVar80._0_4_ + auVar88._0_4_ + auVar83._0_4_;
  auVar89._4_4_ = auVar81._4_4_ + auVar80._4_4_ + auVar88._4_4_ + auVar83._4_4_;
  auVar89._8_4_ = auVar81._8_4_ + auVar80._8_4_ + auVar88._8_4_ + auVar83._8_4_;
  auVar89._12_4_ = auVar81._12_4_ + auVar80._12_4_ + auVar88._12_4_ + auVar83._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar87._8_4_ = 0x3e800000;
  auVar87._0_8_ = 0x3e8000003e800000;
  auVar87._12_4_ = 0x3e800000;
  local_480._16_16_ = auVar93._16_16_;
  auVar79 = vmulps_avx512vl(auVar89,auVar87);
  auVar79 = vsubps_avx(auVar79,(undefined1  [16])aVar1);
  auVar79 = vdpps_avx(auVar79,(undefined1  [16])aVar2,0x7f);
  auVar82 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar223._4_12_ = auVar234._4_12_;
  auVar223._0_4_ = auVar82._0_4_;
  local_480._0_16_ = vrcp14ss_avx512f(auVar234._0_16_,auVar223);
  auVar82 = vfnmadd213ss_fma(local_480._0_16_,auVar82,ZEXT416(0x40000000));
  fVar211 = auVar79._0_4_ * local_480._0_4_ * auVar82._0_4_;
  local_6b0 = ZEXT416((uint)fVar211);
  auVar207._4_4_ = fVar211;
  auVar207._0_4_ = fVar211;
  auVar207._8_4_ = fVar211;
  auVar207._12_4_ = fVar211;
  fStack_590 = fVar211;
  _local_5a0 = auVar207;
  fStack_58c = fVar211;
  fStack_588 = fVar211;
  fStack_584 = fVar211;
  auVar79 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar207);
  auVar79 = vblendps_avx(auVar79,auVar234._0_16_,8);
  auVar80 = vsubps_avx(auVar80,auVar79);
  uVar206 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar206;
  local_520._0_4_ = uVar206;
  local_520._8_4_ = uVar206;
  local_520._12_4_ = uVar206;
  local_520._16_4_ = uVar206;
  local_520._20_4_ = uVar206;
  local_520._24_4_ = uVar206;
  local_520._28_4_ = uVar206;
  auVar82 = vsubps_avx(auVar83,auVar79);
  uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar206;
  local_540._0_4_ = uVar206;
  local_540._8_4_ = uVar206;
  local_540._12_4_ = uVar206;
  local_540._16_4_ = uVar206;
  local_540._20_4_ = uVar206;
  local_540._24_4_ = uVar206;
  local_540._28_4_ = uVar206;
  auVar225 = ZEXT3264(local_540);
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar83 = vsubps_avx(auVar88,auVar79);
  auVar81 = vsubps_avx(auVar81,auVar79);
  local_1a0 = auVar80._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  local_5e0 = ZEXT1632(auVar80);
  local_1c0 = vpermps_avx2(auVar119,local_5e0);
  auVar120._8_4_ = 2.8026e-45;
  auVar120._0_8_ = 0x200000002;
  auVar120._12_4_ = 2.8026e-45;
  auVar120._16_4_ = 2.8026e-45;
  auVar120._20_4_ = 2.8026e-45;
  auVar120._24_4_ = 2.8026e-45;
  auVar120._28_4_ = 2.8026e-45;
  local_1e0 = vpermps_avx2(auVar120,local_5e0);
  auVar121._8_4_ = 3;
  auVar121._0_8_ = 0x300000003;
  auVar121._12_4_ = 3;
  auVar121._16_4_ = 3;
  auVar121._20_4_ = 3;
  auVar121._24_4_ = 3;
  auVar121._28_4_ = 3;
  local_200 = vpermps_avx2(auVar121,local_5e0);
  local_220 = auVar83._0_4_;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_620 = ZEXT1632(auVar83);
  local_240 = vpermps_avx2(auVar119,local_620);
  local_260 = vpermps_avx2(auVar120,local_620);
  local_280 = vpermps_avx2(auVar121,local_620);
  local_2a0 = auVar82._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_600 = ZEXT1632(auVar82);
  local_2c0 = vpermps_avx2(auVar119,local_600);
  local_2e0 = vpermps_avx2(auVar120,local_600);
  local_300 = vpermps_avx2(auVar121,local_600);
  uVar206 = auVar81._0_4_;
  local_320._4_4_ = uVar206;
  local_320._0_4_ = uVar206;
  fStack_318 = (float)uVar206;
  fStack_314 = (float)uVar206;
  fStack_310 = (float)uVar206;
  fStack_30c = (float)uVar206;
  fStack_308 = (float)uVar206;
  register0x0000131c = uVar206;
  auVar205 = ZEXT3264(_local_320);
  _local_640 = ZEXT1632(auVar81);
  _local_340 = vpermps_avx2(auVar119,_local_640);
  _local_360 = vpermps_avx2(auVar120,_local_640);
  local_380 = vpermps_avx2(auVar121,_local_640);
  auVar93 = vpermps_avx2(auVar120,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar80 = vfmadd231ps_fma(auVar93,local_540,local_540);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_520,local_520);
  local_3a0 = ZEXT1632(auVar80);
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar80),auVar118);
  local_730 = 1;
  local_7c8 = 0;
  auVar195 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar80 = vmovshdup_avx(auVar195._0_16_);
    fVar156 = auVar195._0_4_;
    fVar211 = auVar80._0_4_ - fVar156;
    fVar229 = fVar211 * 0.04761905;
    local_780 = auVar195._0_16_;
    local_880._4_4_ = fVar156;
    local_880._0_4_ = fVar156;
    local_880._8_4_ = fVar156;
    local_880._12_4_ = fVar156;
    local_880._16_4_ = fVar156;
    local_880._20_4_ = fVar156;
    local_880._24_4_ = fVar156;
    local_880._28_4_ = fVar156;
    local_700._4_4_ = fVar211;
    local_700._0_4_ = fVar211;
    local_700._8_4_ = fVar211;
    local_700._12_4_ = fVar211;
    local_700._16_4_ = fVar211;
    local_700._20_4_ = fVar211;
    local_700._24_4_ = fVar211;
    local_700._28_4_ = fVar211;
    auVar80 = vfmadd231ps_fma(local_880,local_700,_DAT_02020f20);
    auVar142._8_4_ = 0x3f800000;
    auVar142._0_8_ = &DAT_3f8000003f800000;
    auVar142._12_4_ = 0x3f800000;
    auVar142._16_4_ = 0x3f800000;
    auVar142._20_4_ = 0x3f800000;
    auVar142._24_4_ = 0x3f800000;
    auVar142._28_4_ = 0x3f800000;
    auVar93 = vsubps_avx(auVar142,ZEXT1632(auVar80));
    auVar67._4_4_ = fStack_21c;
    auVar67._0_4_ = local_220;
    auVar67._8_4_ = fStack_218;
    auVar67._12_4_ = fStack_214;
    auVar67._16_4_ = fStack_210;
    auVar67._20_4_ = fStack_20c;
    auVar67._24_4_ = fStack_208;
    auVar67._28_4_ = fStack_204;
    fVar211 = auVar80._0_4_;
    fVar135 = auVar80._4_4_;
    auVar60._4_4_ = fStack_21c * fVar135;
    auVar60._0_4_ = local_220 * fVar211;
    fVar215 = auVar80._8_4_;
    auVar60._8_4_ = fStack_218 * fVar215;
    fVar216 = auVar80._12_4_;
    auVar60._12_4_ = fStack_214 * fVar216;
    auVar60._16_4_ = fStack_210 * 0.0;
    auVar60._20_4_ = fStack_20c * 0.0;
    auVar60._24_4_ = fStack_208 * 0.0;
    auVar60._28_4_ = auVar120._28_4_;
    auVar234._0_4_ = local_240._0_4_ * fVar211;
    auVar234._4_4_ = local_240._4_4_ * fVar135;
    auVar234._8_4_ = local_240._8_4_ * fVar215;
    auVar234._12_4_ = local_240._12_4_ * fVar216;
    auVar234._16_4_ = local_240._16_4_ * 0.0;
    auVar234._20_4_ = local_240._20_4_ * 0.0;
    auVar234._28_36_ = auVar195._28_36_;
    auVar234._24_4_ = local_240._24_4_ * 0.0;
    auVar195._0_4_ = local_260._0_4_ * fVar211;
    auVar195._4_4_ = local_260._4_4_ * fVar135;
    auVar195._8_4_ = local_260._8_4_ * fVar215;
    auVar195._12_4_ = local_260._12_4_ * fVar216;
    auVar195._16_4_ = local_260._16_4_ * 0.0;
    auVar195._20_4_ = local_260._20_4_ * 0.0;
    auVar195._28_36_ = auVar205._28_36_;
    auVar195._24_4_ = local_260._24_4_ * 0.0;
    auVar205._0_4_ = local_280._0_4_ * fVar211;
    auVar205._4_4_ = local_280._4_4_ * fVar135;
    auVar205._8_4_ = local_280._8_4_ * fVar215;
    auVar205._12_4_ = local_280._12_4_ * fVar216;
    auVar205._16_4_ = local_280._16_4_ * 0.0;
    auVar205._20_4_ = local_280._20_4_ * 0.0;
    auVar205._28_36_ = auVar225._28_36_;
    auVar205._24_4_ = local_280._24_4_ * 0.0;
    auVar68._4_4_ = uStack_19c;
    auVar68._0_4_ = local_1a0;
    auVar68._8_4_ = uStack_198;
    auVar68._12_4_ = uStack_194;
    auVar68._16_4_ = uStack_190;
    auVar68._20_4_ = uStack_18c;
    auVar68._24_4_ = uStack_188;
    auVar68._28_4_ = uStack_184;
    auVar81 = vfmadd231ps_fma(auVar60,auVar93,auVar68);
    auVar79 = vfmadd231ps_fma(auVar234._0_32_,auVar93,local_1c0);
    auVar82 = vfmadd231ps_fma(auVar195._0_32_,auVar93,local_1e0);
    auVar83 = vfmadd231ps_fma(auVar205._0_32_,auVar93,local_200);
    auVar66._4_4_ = uStack_29c;
    auVar66._0_4_ = local_2a0;
    auVar66._8_4_ = uStack_298;
    auVar66._12_4_ = uStack_294;
    auVar66._16_4_ = uStack_290;
    auVar66._20_4_ = uStack_28c;
    auVar66._24_4_ = uStack_288;
    auVar66._28_4_ = uStack_284;
    auVar95 = vmulps_avx512vl(auVar66,ZEXT1632(auVar80));
    auVar101 = ZEXT1632(auVar80);
    auVar96 = vmulps_avx512vl(local_2c0,auVar101);
    auVar97 = vmulps_avx512vl(local_2e0,auVar101);
    auVar98 = vmulps_avx512vl(local_300,auVar101);
    auVar88 = vfmadd231ps_fma(auVar95,auVar93,auVar67);
    auVar3 = vfmadd231ps_fma(auVar96,auVar93,local_240);
    auVar84 = vfmadd231ps_fma(auVar97,auVar93,local_260);
    auVar85 = vfmadd231ps_fma(auVar98,auVar93,local_280);
    auVar41._4_4_ = fVar135 * (float)local_320._4_4_;
    auVar41._0_4_ = fVar211 * (float)local_320._0_4_;
    auVar41._8_4_ = fVar215 * fStack_318;
    auVar41._12_4_ = fVar216 * fStack_314;
    auVar41._16_4_ = fStack_310 * 0.0;
    auVar41._20_4_ = fStack_30c * 0.0;
    auVar41._24_4_ = fStack_308 * 0.0;
    auVar41._28_4_ = local_240._28_4_;
    auVar42._4_4_ = fVar135 * (float)local_340._4_4_;
    auVar42._0_4_ = fVar211 * (float)local_340._0_4_;
    auVar42._8_4_ = fVar215 * fStack_338;
    auVar42._12_4_ = fVar216 * fStack_334;
    auVar42._16_4_ = fStack_330 * 0.0;
    auVar42._20_4_ = fStack_32c * 0.0;
    auVar42._24_4_ = fStack_328 * 0.0;
    auVar42._28_4_ = local_260._28_4_;
    auVar43._4_4_ = fVar135 * (float)local_360._4_4_;
    auVar43._0_4_ = fVar211 * (float)local_360._0_4_;
    auVar43._8_4_ = fVar215 * fStack_358;
    auVar43._12_4_ = fVar216 * fStack_354;
    auVar43._16_4_ = fStack_350 * 0.0;
    auVar43._20_4_ = fStack_34c * 0.0;
    auVar43._24_4_ = fStack_348 * 0.0;
    auVar43._28_4_ = local_280._28_4_;
    auVar95 = vmulps_avx512vl(auVar101,local_380);
    auVar96 = vfmadd231ps_avx512vl(auVar41,auVar93,auVar66);
    auVar97 = vfmadd231ps_avx512vl(auVar42,auVar93,local_2c0);
    auVar98 = vfmadd231ps_avx512vl(auVar43,auVar93,local_2e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_300);
    auVar94 = vmulps_avx512vl(auVar101,ZEXT1632(auVar88));
    auVar99 = vmulps_avx512vl(auVar101,ZEXT1632(auVar3));
    auVar100 = vmulps_avx512vl(auVar101,ZEXT1632(auVar84));
    auVar101 = vmulps_avx512vl(auVar101,ZEXT1632(auVar85));
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,ZEXT1632(auVar81));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar82));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar83));
    auVar224._0_4_ = auVar96._0_4_ * fVar211;
    auVar224._4_4_ = auVar96._4_4_ * fVar135;
    auVar224._8_4_ = auVar96._8_4_ * fVar215;
    auVar224._12_4_ = auVar96._12_4_ * fVar216;
    auVar224._16_4_ = auVar96._16_4_ * 0.0;
    auVar224._20_4_ = auVar96._20_4_ * 0.0;
    auVar224._24_4_ = auVar96._24_4_ * 0.0;
    auVar224._28_4_ = 0;
    auVar44._4_4_ = auVar97._4_4_ * fVar135;
    auVar44._0_4_ = auVar97._0_4_ * fVar211;
    auVar44._8_4_ = auVar97._8_4_ * fVar215;
    auVar44._12_4_ = auVar97._12_4_ * fVar216;
    auVar44._16_4_ = auVar97._16_4_ * 0.0;
    auVar44._20_4_ = auVar97._20_4_ * 0.0;
    auVar44._24_4_ = auVar97._24_4_ * 0.0;
    auVar44._28_4_ = auVar96._28_4_;
    auVar45._4_4_ = auVar98._4_4_ * fVar135;
    auVar45._0_4_ = auVar98._0_4_ * fVar211;
    auVar45._8_4_ = auVar98._8_4_ * fVar215;
    auVar45._12_4_ = auVar98._12_4_ * fVar216;
    auVar45._16_4_ = auVar98._16_4_ * 0.0;
    auVar45._20_4_ = auVar98._20_4_ * 0.0;
    auVar45._24_4_ = auVar98._24_4_ * 0.0;
    auVar45._28_4_ = auVar97._28_4_;
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar80),auVar95);
    auVar80 = vfmadd231ps_fma(auVar224,auVar93,ZEXT1632(auVar88));
    auVar81 = vfmadd231ps_fma(auVar44,auVar93,ZEXT1632(auVar3));
    auVar79 = vfmadd231ps_fma(auVar45,auVar93,ZEXT1632(auVar84));
    auVar82 = vfmadd231ps_fma(auVar95,auVar93,ZEXT1632(auVar85));
    auVar102 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar216,
                                             CONCAT48(auVar80._8_4_ * fVar215,
                                                      CONCAT44(auVar80._4_4_ * fVar135,
                                                               auVar80._0_4_ * fVar211)))),auVar93,
                          auVar94);
    auVar205 = ZEXT3264(auVar102);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar216,
                                            CONCAT48(auVar81._8_4_ * fVar215,
                                                     CONCAT44(auVar81._4_4_ * fVar135,
                                                              auVar81._0_4_ * fVar211)))),auVar93,
                         auVar99);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar216,
                                             CONCAT48(auVar79._8_4_ * fVar215,
                                                      CONCAT44(auVar79._4_4_ * fVar135,
                                                               auVar79._0_4_ * fVar211)))),auVar93,
                          auVar100);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar82._12_4_ * fVar216,
                                            CONCAT48(auVar82._8_4_ * fVar215,
                                                     CONCAT44(auVar82._4_4_ * fVar135,
                                                              auVar82._0_4_ * fVar211)))),auVar101,
                         auVar93);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar80),auVar94);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar81),auVar99);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar79),auVar100);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar82),auVar101);
    auVar231._0_4_ = fVar229 * auVar93._0_4_ * 3.0;
    auVar231._4_4_ = fVar229 * auVar93._4_4_ * 3.0;
    auVar231._8_4_ = fVar229 * auVar93._8_4_ * 3.0;
    auVar231._12_4_ = fVar229 * auVar93._12_4_ * 3.0;
    auVar231._16_4_ = fVar229 * auVar93._16_4_ * 3.0;
    auVar231._20_4_ = fVar229 * auVar93._20_4_ * 3.0;
    auVar231._24_4_ = fVar229 * auVar93._24_4_ * 3.0;
    auVar231._28_4_ = 0;
    auVar233._0_4_ = auVar95._0_4_ * 3.0 * fVar229;
    auVar233._4_4_ = auVar95._4_4_ * 3.0 * fVar229;
    auVar233._8_4_ = auVar95._8_4_ * 3.0 * fVar229;
    auVar233._12_4_ = auVar95._12_4_ * 3.0 * fVar229;
    auVar233._16_4_ = auVar95._16_4_ * 3.0 * fVar229;
    auVar233._20_4_ = auVar95._20_4_ * 3.0 * fVar229;
    auVar233._24_4_ = auVar95._24_4_ * 3.0 * fVar229;
    auVar233._28_4_ = 0;
    auVar235._0_4_ = auVar97._0_4_ * 3.0 * fVar229;
    auVar235._4_4_ = auVar97._4_4_ * 3.0 * fVar229;
    auVar235._8_4_ = auVar97._8_4_ * 3.0 * fVar229;
    auVar235._12_4_ = auVar97._12_4_ * 3.0 * fVar229;
    auVar235._16_4_ = auVar97._16_4_ * 3.0 * fVar229;
    auVar235._20_4_ = auVar97._20_4_ * 3.0 * fVar229;
    auVar235._24_4_ = auVar97._24_4_ * 3.0 * fVar229;
    auVar235._28_4_ = 0;
    fVar211 = auVar98._0_4_ * 3.0 * fVar229;
    fVar135 = auVar98._4_4_ * 3.0 * fVar229;
    auVar46._4_4_ = fVar135;
    auVar46._0_4_ = fVar211;
    fVar215 = auVar98._8_4_ * 3.0 * fVar229;
    auVar46._8_4_ = fVar215;
    fVar216 = auVar98._12_4_ * 3.0 * fVar229;
    auVar46._12_4_ = fVar216;
    fVar217 = auVar98._16_4_ * 3.0 * fVar229;
    auVar46._16_4_ = fVar217;
    fVar218 = auVar98._20_4_ * 3.0 * fVar229;
    auVar46._20_4_ = fVar218;
    fVar191 = auVar98._24_4_ * 3.0 * fVar229;
    auVar46._24_4_ = fVar191;
    auVar46._28_4_ = fVar229;
    auVar80 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,ZEXT1632(auVar80));
    auVar225 = ZEXT3264(auVar94);
    auVar99 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,ZEXT1632(auVar80));
    auVar97 = ZEXT1632(auVar80);
    auVar100 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,auVar97);
    auVar219._0_4_ = auVar96._0_4_ + fVar211;
    auVar219._4_4_ = auVar96._4_4_ + fVar135;
    auVar219._8_4_ = auVar96._8_4_ + fVar215;
    auVar219._12_4_ = auVar96._12_4_ + fVar216;
    auVar219._16_4_ = auVar96._16_4_ + fVar217;
    auVar219._20_4_ = auVar96._20_4_ + fVar218;
    auVar219._24_4_ = auVar96._24_4_ + fVar191;
    auVar219._28_4_ = auVar96._28_4_ + fVar229;
    auVar93 = vmaxps_avx(auVar96,auVar219);
    auVar95 = vminps_avx(auVar96,auVar219);
    auVar101 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar97);
    auVar104 = vpermt2ps_avx512vl(auVar231,_DAT_0205fd20,auVar97);
    auVar90 = vpermt2ps_avx512vl(auVar233,_DAT_0205fd20,auVar97);
    auVar113 = ZEXT1632(auVar80);
    auVar91 = vpermt2ps_avx512vl(auVar235,_DAT_0205fd20,auVar113);
    auVar96 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar113);
    auVar105 = vsubps_avx512vl(auVar101,auVar96);
    auVar96 = vsubps_avx(auVar94,auVar102);
    auVar97 = vsubps_avx(auVar99,auVar92);
    auVar98 = vsubps_avx(auVar100,auVar103);
    auVar106 = vmulps_avx512vl(auVar97,auVar235);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar233,auVar98);
    auVar107 = vmulps_avx512vl(auVar98,auVar231);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar235,auVar96);
    auVar108 = vmulps_avx512vl(auVar96,auVar233);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar231,auVar97);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar98,auVar98);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,auVar96);
    auVar108 = vrcp14ps_avx512vl(auVar107);
    auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar142);
    auVar108 = vfmadd132ps_avx512vl(auVar109,auVar108,auVar108);
    auVar106 = vmulps_avx512vl(auVar106,auVar108);
    auVar109 = vmulps_avx512vl(auVar97,auVar91);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar90,auVar98);
    auVar110 = vmulps_avx512vl(auVar98,auVar104);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar91,auVar96);
    auVar111 = vmulps_avx512vl(auVar96,auVar90);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar104,auVar97);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar106 = vmaxps_avx512vl(auVar106,auVar108);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar108 = vmaxps_avx512vl(auVar105,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar108);
    auVar93 = vaddps_avx512vl(auVar106,auVar93);
    auVar101 = vminps_avx512vl(auVar105,auVar101);
    auVar95 = vminps_avx512vl(auVar95,auVar101);
    auVar95 = vsubps_avx512vl(auVar95,auVar106);
    auVar26._8_4_ = 0x3f800002;
    auVar26._0_8_ = 0x3f8000023f800002;
    auVar26._12_4_ = 0x3f800002;
    auVar26._16_4_ = 0x3f800002;
    auVar26._20_4_ = 0x3f800002;
    auVar26._24_4_ = 0x3f800002;
    auVar26._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar93,auVar26);
    auVar27._8_4_ = 0x3f7ffffc;
    auVar27._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar27._12_4_ = 0x3f7ffffc;
    auVar27._16_4_ = 0x3f7ffffc;
    auVar27._20_4_ = 0x3f7ffffc;
    auVar27._24_4_ = 0x3f7ffffc;
    auVar27._28_4_ = 0x3f7ffffc;
    local_720 = vmulps_avx512vl(auVar95,auVar27);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar95 = vrsqrt14ps_avx512vl(auVar107);
    auVar28._8_4_ = 0xbf000000;
    auVar28._0_8_ = 0xbf000000bf000000;
    auVar28._12_4_ = 0xbf000000;
    auVar28._16_4_ = 0xbf000000;
    auVar28._20_4_ = 0xbf000000;
    auVar28._24_4_ = 0xbf000000;
    auVar28._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar107,auVar28);
    auVar47._4_4_ = auVar95._4_4_ * auVar101._4_4_;
    auVar47._0_4_ = auVar95._0_4_ * auVar101._0_4_;
    auVar47._8_4_ = auVar95._8_4_ * auVar101._8_4_;
    auVar47._12_4_ = auVar95._12_4_ * auVar101._12_4_;
    auVar47._16_4_ = auVar95._16_4_ * auVar101._16_4_;
    auVar47._20_4_ = auVar95._20_4_ * auVar101._20_4_;
    auVar47._24_4_ = auVar95._24_4_ * auVar101._24_4_;
    auVar47._28_4_ = auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar95,auVar95);
    auVar101 = vmulps_avx512vl(auVar101,auVar47);
    auVar29._8_4_ = 0x3fc00000;
    auVar29._0_8_ = 0x3fc000003fc00000;
    auVar29._12_4_ = 0x3fc00000;
    auVar29._16_4_ = 0x3fc00000;
    auVar29._20_4_ = 0x3fc00000;
    auVar29._24_4_ = 0x3fc00000;
    auVar29._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar29);
    auVar48._4_4_ = auVar101._4_4_ * auVar96._4_4_;
    auVar48._0_4_ = auVar101._0_4_ * auVar96._0_4_;
    auVar48._8_4_ = auVar101._8_4_ * auVar96._8_4_;
    auVar48._12_4_ = auVar101._12_4_ * auVar96._12_4_;
    auVar48._16_4_ = auVar101._16_4_ * auVar96._16_4_;
    auVar48._20_4_ = auVar101._20_4_ * auVar96._20_4_;
    auVar48._24_4_ = auVar101._24_4_ * auVar96._24_4_;
    auVar48._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(auVar97,auVar101);
    auVar105 = vmulps_avx512vl(auVar98,auVar101);
    auVar106 = vsubps_avx512vl(auVar113,auVar102);
    auVar107 = vsubps_avx512vl(auVar113,auVar92);
    auVar108 = vsubps_avx512vl(auVar113,auVar103);
    auVar61._4_4_ = uStack_55c;
    auVar61._0_4_ = local_560;
    auVar61._8_4_ = uStack_558;
    auVar61._12_4_ = uStack_554;
    auVar61._16_4_ = uStack_550;
    auVar61._20_4_ = uStack_54c;
    auVar61._24_4_ = uStack_548;
    auVar61._28_4_ = uStack_544;
    auVar109 = vmulps_avx512vl(auVar61,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_540,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_520,auVar106);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar106);
    auVar111 = vmulps_avx512vl(auVar61,auVar105);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar95,local_540);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar48,local_520);
    auVar105 = vmulps_avx512vl(auVar108,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,auVar48);
    local_6e0 = vmulps_avx512vl(auVar111,auVar111);
    auVar105 = vsubps_avx512vl(local_3a0,local_6e0);
    auVar112 = vmulps_avx512vl(auVar111,auVar95);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar95,auVar95);
    local_840 = vsubps_avx512vl(auVar110,auVar112);
    auVar110 = vsubps_avx512vl(local_840,auVar93);
    local_820 = vmulps_avx512vl(auVar109,auVar109);
    auVar30._8_4_ = 0x40800000;
    auVar30._0_8_ = 0x4080000040800000;
    auVar30._12_4_ = 0x40800000;
    auVar30._16_4_ = 0x40800000;
    auVar30._20_4_ = 0x40800000;
    auVar30._24_4_ = 0x40800000;
    auVar30._28_4_ = 0x40800000;
    auVar112 = vmulps_avx512vl(auVar105,auVar30);
    auVar93 = vmulps_avx512vl(auVar112,auVar110);
    auVar93 = vsubps_avx512vl(local_820,auVar93);
    uVar77 = vcmpps_avx512vl(auVar93,auVar113,5);
    bVar69 = (byte)uVar77;
    if (bVar69 == 0) {
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar93 = auVar116;
    }
    else {
      auVar93 = vsqrtps_avx512vl(auVar93);
      auVar113 = vaddps_avx512vl(auVar105,auVar105);
      auVar114 = vrcp14ps_avx512vl(auVar113);
      auVar113 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar142);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar114,auVar114);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar114 = vxorps_avx512vl(auVar109,auVar31);
      auVar114 = vsubps_avx512vl(auVar114,auVar93);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar93 = vsubps_avx512vl(auVar93,auVar109);
      auVar93 = vmulps_avx512vl(auVar93,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar111,auVar114,auVar95);
      local_4c0 = vmulps_avx512vl(auVar101,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar111,auVar93,auVar95);
      local_4e0 = vmulps_avx512vl(auVar101,auVar113);
      auVar143._8_4_ = 0x7f800000;
      auVar143._0_8_ = 0x7f8000007f800000;
      auVar143._12_4_ = 0x7f800000;
      auVar143._16_4_ = 0x7f800000;
      auVar143._20_4_ = 0x7f800000;
      auVar143._24_4_ = 0x7f800000;
      auVar143._28_4_ = 0x7f800000;
      auVar113 = vblendmps_avx512vl(auVar143,auVar114);
      auVar115._0_4_ =
           (uint)(bVar69 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar69 & 1) * local_4e0._0_4_;
      bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar8 * auVar113._4_4_ | (uint)!bVar8 * local_4e0._4_4_;
      bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar8 * auVar113._8_4_ | (uint)!bVar8 * local_4e0._8_4_;
      bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar8 * auVar113._12_4_ | (uint)!bVar8 * local_4e0._12_4_;
      bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * local_4e0._16_4_;
      bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar8 * auVar113._20_4_ | (uint)!bVar8 * local_4e0._20_4_;
      bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar8 * auVar113._24_4_ | (uint)!bVar8 * local_4e0._24_4_;
      bVar8 = SUB81(uVar77 >> 7,0);
      auVar115._28_4_ = (uint)bVar8 * auVar113._28_4_ | (uint)!bVar8 * local_4e0._28_4_;
      auVar144._8_4_ = 0xff800000;
      auVar144._0_8_ = 0xff800000ff800000;
      auVar144._12_4_ = 0xff800000;
      auVar144._16_4_ = 0xff800000;
      auVar144._20_4_ = 0xff800000;
      auVar144._24_4_ = 0xff800000;
      auVar144._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar144,auVar93);
      auVar116._0_4_ =
           (uint)(bVar69 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
      bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar8 * auVar113._4_4_ | (uint)!bVar8 * auVar93._4_4_;
      bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar8 * auVar113._8_4_ | (uint)!bVar8 * auVar93._8_4_;
      bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar8 * auVar113._12_4_ | (uint)!bVar8 * auVar93._12_4_;
      bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar8 * auVar113._16_4_ | (uint)!bVar8 * auVar93._16_4_;
      bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar8 * auVar113._20_4_ | (uint)!bVar8 * auVar93._20_4_;
      bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar8 * auVar113._24_4_ | (uint)!bVar8 * auVar93._24_4_;
      bVar8 = SUB81(uVar77 >> 7,0);
      auVar116._28_4_ = (uint)bVar8 * auVar113._28_4_ | (uint)!bVar8 * auVar93._28_4_;
      auVar145._8_4_ = 0x7fffffff;
      auVar145._0_8_ = 0x7fffffff7fffffff;
      auVar145._12_4_ = 0x7fffffff;
      auVar145._16_4_ = 0x7fffffff;
      auVar145._20_4_ = 0x7fffffff;
      auVar145._24_4_ = 0x7fffffff;
      auVar145._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6e0,auVar145);
      auVar93 = vmaxps_avx512vl(local_480,local_6e0);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar93 = vmulps_avx512vl(auVar93,auVar32);
      auVar113 = vandps_avx(auVar105,auVar145);
      uVar71 = vcmpps_avx512vl(auVar113,auVar93,1);
      uVar77 = uVar77 & uVar71;
      bVar74 = (byte)uVar77;
      auVar93 = local_6e0;
      if (bVar74 != 0) {
        uVar71 = vcmpps_avx512vl(auVar110,_DAT_02020f00,2);
        auVar175._8_4_ = 0xff800000;
        auVar175._0_8_ = 0xff800000ff800000;
        auVar175._12_4_ = 0xff800000;
        auVar175._16_4_ = 0xff800000;
        auVar175._20_4_ = 0xff800000;
        auVar175._24_4_ = 0xff800000;
        auVar175._28_4_ = 0xff800000;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar114 = vblendmps_avx512vl(auVar110,auVar175);
        bVar72 = (byte)uVar71;
        uVar78 = (uint)(bVar72 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar113._0_4_;
        bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar128 = (uint)bVar8 * auVar114._4_4_ | (uint)!bVar8 * auVar113._4_4_;
        bVar8 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar129 = (uint)bVar8 * auVar114._8_4_ | (uint)!bVar8 * auVar113._8_4_;
        bVar8 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar130 = (uint)bVar8 * auVar114._12_4_ | (uint)!bVar8 * auVar113._12_4_;
        bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar131 = (uint)bVar8 * auVar114._16_4_ | (uint)!bVar8 * auVar113._16_4_;
        bVar8 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar132 = (uint)bVar8 * auVar114._20_4_ | (uint)!bVar8 * auVar113._20_4_;
        bVar8 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar133 = (uint)bVar8 * auVar114._24_4_ | (uint)!bVar8 * auVar113._24_4_;
        bVar8 = SUB81(uVar71 >> 7,0);
        uVar134 = (uint)bVar8 * auVar114._28_4_ | (uint)!bVar8 * auVar113._28_4_;
        auVar115._0_4_ = (bVar74 & 1) * uVar78 | !(bool)(bVar74 & 1) * auVar115._0_4_;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = bVar8 * uVar128 | !bVar8 * auVar115._4_4_;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = bVar8 * uVar129 | !bVar8 * auVar115._8_4_;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = bVar8 * uVar130 | !bVar8 * auVar115._12_4_;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar115._16_4_ = bVar8 * uVar131 | !bVar8 * auVar115._16_4_;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar115._20_4_ = bVar8 * uVar132 | !bVar8 * auVar115._20_4_;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar115._24_4_ = bVar8 * uVar133 | !bVar8 * auVar115._24_4_;
        bVar8 = SUB81(uVar77 >> 7,0);
        auVar115._28_4_ = bVar8 * uVar134 | !bVar8 * auVar115._28_4_;
        auVar110 = vblendmps_avx512vl(auVar175,auVar110);
        bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar72 & 1) * auVar110._0_4_ | !(bool)(bVar72 & 1) * uVar78) |
             !(bool)(bVar74 & 1) * auVar116._0_4_;
        bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar76 * ((uint)bVar8 * auVar110._4_4_ | !bVar8 * uVar128) |
             !bVar76 * auVar116._4_4_;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar8 * ((uint)bVar9 * auVar110._8_4_ | !bVar9 * uVar129) |
             !bVar8 * auVar116._8_4_;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar8 * ((uint)bVar10 * auVar110._12_4_ | !bVar10 * uVar130) |
             !bVar8 * auVar116._12_4_;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar8 * ((uint)bVar11 * auVar110._16_4_ | !bVar11 * uVar131) |
             !bVar8 * auVar116._16_4_;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar8 * ((uint)bVar12 * auVar110._20_4_ | !bVar12 * uVar132) |
             !bVar8 * auVar116._20_4_;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar8 * ((uint)bVar13 * auVar110._24_4_ | !bVar13 * uVar133) |
             !bVar8 * auVar116._24_4_;
        bVar8 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar8 * ((uint)bVar14 * auVar110._28_4_ | !bVar14 * uVar134) |
             !bVar8 * auVar116._28_4_;
        bVar69 = (~bVar74 | bVar72) & bVar69;
      }
    }
    in_ZMM31 = ZEXT3264(auVar115);
    if ((bVar69 & 0x7f) == 0) {
LAB_01d6f5aa:
      auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar80 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_6b0);
      auVar146._0_4_ = auVar80._0_4_;
      auVar146._4_4_ = auVar146._0_4_;
      auVar146._8_4_ = auVar146._0_4_;
      auVar146._12_4_ = auVar146._0_4_;
      auVar146._16_4_ = auVar146._0_4_;
      auVar146._20_4_ = auVar146._0_4_;
      auVar146._24_4_ = auVar146._0_4_;
      auVar146._28_4_ = auVar146._0_4_;
      auVar93 = vmaxps_avx512vl(auVar146,auVar115);
      auVar80 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_6b0);
      auVar171._0_4_ = auVar80._0_4_;
      auVar171._4_4_ = auVar171._0_4_;
      auVar171._8_4_ = auVar171._0_4_;
      auVar171._12_4_ = auVar171._0_4_;
      auVar171._16_4_ = auVar171._0_4_;
      auVar171._20_4_ = auVar171._0_4_;
      auVar171._24_4_ = auVar171._0_4_;
      auVar171._28_4_ = auVar171._0_4_;
      auVar110 = vminps_avx512vl(auVar171,auVar116);
      auVar108 = vmulps_avx512vl(auVar108,auVar235);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar233,auVar108);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar231,auVar107);
      auVar62._4_4_ = uStack_55c;
      auVar62._0_4_ = local_560;
      auVar62._8_4_ = uStack_558;
      auVar62._12_4_ = uStack_554;
      auVar62._16_4_ = uStack_550;
      auVar62._20_4_ = uStack_54c;
      auVar62._24_4_ = uStack_548;
      auVar62._28_4_ = uStack_544;
      auVar107 = vmulps_avx512vl(auVar62,auVar235);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_540,auVar233);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar231);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar108,auVar113,1);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar114);
      auVar106 = vxorps_avx512vl(auVar106,auVar114);
      auVar117 = vrcp14ps_avx512vl(auVar107);
      auVar118 = vxorps_avx512vl(auVar107,auVar114);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar120 = vfnmadd213ps_avx512vl(auVar117,auVar107,auVar119);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar117,auVar117);
      auVar106 = vmulps_avx512vl(auVar120,auVar106);
      uVar17 = vcmpps_avx512vl(auVar107,auVar118,1);
      bVar74 = (byte)uVar16 | (byte)uVar17;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar106,auVar120);
      auVar122._0_4_ =
           (uint)(bVar74 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar117._0_4_;
      bVar8 = (bool)(bVar74 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar8 * auVar121._4_4_ | (uint)!bVar8 * auVar117._4_4_;
      bVar8 = (bool)(bVar74 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar8 * auVar121._8_4_ | (uint)!bVar8 * auVar117._8_4_;
      bVar8 = (bool)(bVar74 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar8 * auVar121._12_4_ | (uint)!bVar8 * auVar117._12_4_;
      bVar8 = (bool)(bVar74 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar8 * auVar121._16_4_ | (uint)!bVar8 * auVar117._16_4_;
      bVar8 = (bool)(bVar74 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar8 * auVar121._20_4_ | (uint)!bVar8 * auVar117._20_4_;
      bVar8 = (bool)(bVar74 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar8 * auVar121._24_4_ | (uint)!bVar8 * auVar117._24_4_;
      auVar122._28_4_ =
           (uint)(bVar74 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar117._28_4_;
      auVar93 = vmaxps_avx(auVar93,auVar122);
      uVar17 = vcmpps_avx512vl(auVar107,auVar118,6);
      bVar74 = (byte)uVar16 | (byte)uVar17;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123._0_4_ =
           (uint)(bVar74 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar106._0_4_;
      bVar8 = (bool)(bVar74 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar8 * auVar107._4_4_ | (uint)!bVar8 * auVar106._4_4_;
      bVar8 = (bool)(bVar74 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar8 * auVar107._8_4_ | (uint)!bVar8 * auVar106._8_4_;
      bVar8 = (bool)(bVar74 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar8 * auVar107._12_4_ | (uint)!bVar8 * auVar106._12_4_;
      bVar8 = (bool)(bVar74 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar8 * auVar107._16_4_ | (uint)!bVar8 * auVar106._16_4_;
      bVar8 = (bool)(bVar74 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * auVar106._20_4_;
      bVar8 = (bool)(bVar74 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar8 * auVar107._24_4_ | (uint)!bVar8 * auVar106._24_4_;
      auVar123._28_4_ =
           (uint)(bVar74 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar106._28_4_;
      auVar106 = vminps_avx(auVar110,auVar123);
      auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar94);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar100 = vmulps_avx512vl(auVar100,auVar91);
      auVar99 = vfnmsub231ps_avx512vl(auVar100,auVar90,auVar99);
      auVar94 = vfnmadd231ps_avx512vl(auVar99,auVar104,auVar94);
      auVar99 = vmulps_avx512vl(auVar62,auVar91);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,local_540,auVar90);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_520,auVar104);
      vandps_avx512vl(auVar99,auVar108);
      uVar16 = vcmpps_avx512vl(auVar99,auVar113,1);
      auVar94 = vxorps_avx512vl(auVar94,auVar114);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar104 = vxorps_avx512vl(auVar99,auVar114);
      auVar91 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar119);
      auVar80 = vfmadd132ps_fma(auVar91,auVar100,auVar100);
      fVar211 = auVar80._0_4_ * auVar94._0_4_;
      fVar135 = auVar80._4_4_ * auVar94._4_4_;
      auVar49._4_4_ = fVar135;
      auVar49._0_4_ = fVar211;
      fVar215 = auVar80._8_4_ * auVar94._8_4_;
      auVar49._8_4_ = fVar215;
      fVar216 = auVar80._12_4_ * auVar94._12_4_;
      auVar49._12_4_ = fVar216;
      fVar229 = auVar94._16_4_ * 0.0;
      auVar49._16_4_ = fVar229;
      fVar217 = auVar94._20_4_ * 0.0;
      auVar49._20_4_ = fVar217;
      fVar218 = auVar94._24_4_ * 0.0;
      auVar49._24_4_ = fVar218;
      auVar49._28_4_ = auVar94._28_4_;
      uVar17 = vcmpps_avx512vl(auVar99,auVar104,1);
      bVar74 = (byte)uVar16 | (byte)uVar17;
      auVar91 = vblendmps_avx512vl(auVar49,auVar120);
      auVar124._0_4_ =
           (uint)(bVar74 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar100._0_4_;
      bVar8 = (bool)(bVar74 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar8 * auVar91._4_4_ | (uint)!bVar8 * auVar100._4_4_;
      bVar8 = (bool)(bVar74 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar8 * auVar91._8_4_ | (uint)!bVar8 * auVar100._8_4_;
      bVar8 = (bool)(bVar74 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar8 * auVar91._12_4_ | (uint)!bVar8 * auVar100._12_4_;
      bVar8 = (bool)(bVar74 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar8 * auVar91._16_4_ | (uint)!bVar8 * auVar100._16_4_;
      bVar8 = (bool)(bVar74 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar8 * auVar91._20_4_ | (uint)!bVar8 * auVar100._20_4_;
      bVar8 = (bool)(bVar74 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar8 * auVar91._24_4_ | (uint)!bVar8 * auVar100._24_4_;
      auVar124._28_4_ =
           (uint)(bVar74 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar100._28_4_;
      _local_5c0 = vmaxps_avx(auVar93,auVar124);
      uVar17 = vcmpps_avx512vl(auVar99,auVar104,6);
      bVar74 = (byte)uVar16 | (byte)uVar17;
      auVar93._0_4_ = (uint)(bVar74 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)fVar211
      ;
      bVar8 = (bool)(bVar74 >> 1 & 1);
      auVar93._4_4_ = (uint)bVar8 * auVar107._4_4_ | (uint)!bVar8 * (int)fVar135;
      bVar8 = (bool)(bVar74 >> 2 & 1);
      auVar93._8_4_ = (uint)bVar8 * auVar107._8_4_ | (uint)!bVar8 * (int)fVar215;
      bVar8 = (bool)(bVar74 >> 3 & 1);
      auVar93._12_4_ = (uint)bVar8 * auVar107._12_4_ | (uint)!bVar8 * (int)fVar216;
      bVar8 = (bool)(bVar74 >> 4 & 1);
      auVar93._16_4_ = (uint)bVar8 * auVar107._16_4_ | (uint)!bVar8 * (int)fVar229;
      bVar8 = (bool)(bVar74 >> 5 & 1);
      auVar93._20_4_ = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * (int)fVar217;
      bVar8 = (bool)(bVar74 >> 6 & 1);
      auVar93._24_4_ = (uint)bVar8 * auVar107._24_4_ | (uint)!bVar8 * (int)fVar218;
      auVar93._28_4_ =
           (uint)(bVar74 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar94._28_4_;
      local_400 = vminps_avx(auVar106,auVar93);
      auVar225 = ZEXT3264(local_400);
      auVar94 = _local_5c0;
      uVar16 = vcmpps_avx512vl(_local_5c0,local_400,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar16;
      if (bVar69 == 0) goto LAB_01d6f5aa;
      auVar93 = vmaxps_avx(ZEXT832(0) << 0x20,local_720);
      auVar99 = vminps_avx512vl(local_4c0,auVar119);
      auVar57 = ZEXT412(0);
      auVar104 = ZEXT1232(auVar57) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar57) << 0x20);
      auVar100 = vminps_avx512vl(local_4e0,auVar119);
      auVar50._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar99._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar50,local_700,local_880);
      auVar99 = vmaxps_avx(auVar100,ZEXT1232(auVar57) << 0x20);
      auVar51._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar99._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar51,local_700,local_880);
      auVar52._4_4_ = auVar93._4_4_ * auVar93._4_4_;
      auVar52._0_4_ = auVar93._0_4_ * auVar93._0_4_;
      auVar52._8_4_ = auVar93._8_4_ * auVar93._8_4_;
      auVar52._12_4_ = auVar93._12_4_ * auVar93._12_4_;
      auVar52._16_4_ = auVar93._16_4_ * auVar93._16_4_;
      auVar52._20_4_ = auVar93._20_4_ * auVar93._20_4_;
      auVar52._24_4_ = auVar93._24_4_ * auVar93._24_4_;
      auVar52._28_4_ = local_4e0._28_4_;
      auVar99 = vsubps_avx(local_840,auVar52);
      auVar93 = vmulps_avx512vl(auVar112,auVar99);
      auVar100 = vsubps_avx(local_820,auVar93);
      uVar16 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar57) << 0x20,5);
      bVar74 = (byte)uVar16;
      auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
      if (bVar74 == 0) {
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar195 = ZEXT864(0) << 0x20;
        auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar226 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        auVar81 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
        uVar77 = vcmpps_avx512vl(auVar100,ZEXT832(0) << 0x20,5);
        auVar93 = vsqrtps_avx(auVar100);
        auVar172._0_4_ = auVar105._0_4_ + auVar105._0_4_;
        auVar172._4_4_ = auVar105._4_4_ + auVar105._4_4_;
        auVar172._8_4_ = auVar105._8_4_ + auVar105._8_4_;
        auVar172._12_4_ = auVar105._12_4_ + auVar105._12_4_;
        auVar172._16_4_ = auVar105._16_4_ + auVar105._16_4_;
        auVar172._20_4_ = auVar105._20_4_ + auVar105._20_4_;
        auVar172._24_4_ = auVar105._24_4_ + auVar105._24_4_;
        auVar172._28_4_ = auVar105._28_4_ + auVar105._28_4_;
        auVar100 = vrcp14ps_avx512vl(auVar172);
        auVar104 = vfnmadd213ps_avx512vl(auVar172,auVar100,auVar119);
        auVar80 = vfmadd132ps_fma(auVar104,auVar100,auVar100);
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar33._16_4_ = 0x80000000;
        auVar33._20_4_ = 0x80000000;
        auVar33._24_4_ = 0x80000000;
        auVar33._28_4_ = 0x80000000;
        auVar100 = vxorps_avx512vl(auVar109,auVar33);
        auVar100 = vsubps_avx(auVar100,auVar93);
        auVar53._4_4_ = auVar100._4_4_ * auVar80._4_4_;
        auVar53._0_4_ = auVar100._0_4_ * auVar80._0_4_;
        auVar53._8_4_ = auVar100._8_4_ * auVar80._8_4_;
        auVar53._12_4_ = auVar100._12_4_ * auVar80._12_4_;
        auVar53._16_4_ = auVar100._16_4_ * 0.0;
        auVar53._20_4_ = auVar100._20_4_ * 0.0;
        auVar53._24_4_ = auVar100._24_4_ * 0.0;
        auVar53._28_4_ = 0x3e000000;
        auVar93 = vsubps_avx512vl(auVar93,auVar109);
        auVar54._4_4_ = auVar93._4_4_ * auVar80._4_4_;
        auVar54._0_4_ = auVar93._0_4_ * auVar80._0_4_;
        auVar54._8_4_ = auVar93._8_4_ * auVar80._8_4_;
        auVar54._12_4_ = auVar93._12_4_ * auVar80._12_4_;
        auVar54._16_4_ = auVar93._16_4_ * 0.0;
        auVar54._20_4_ = auVar93._20_4_ * 0.0;
        auVar54._24_4_ = auVar93._24_4_ * 0.0;
        auVar54._28_4_ = fVar156;
        auVar93 = vfmadd213ps_avx512vl(auVar111,auVar53,auVar95);
        auVar55._4_4_ = auVar101._4_4_ * auVar93._4_4_;
        auVar55._0_4_ = auVar101._0_4_ * auVar93._0_4_;
        auVar55._8_4_ = auVar101._8_4_ * auVar93._8_4_;
        auVar55._12_4_ = auVar101._12_4_ * auVar93._12_4_;
        auVar55._16_4_ = auVar101._16_4_ * auVar93._16_4_;
        auVar55._20_4_ = auVar101._20_4_ * auVar93._20_4_;
        auVar55._24_4_ = auVar101._24_4_ * auVar93._24_4_;
        auVar55._28_4_ = auVar100._28_4_;
        auVar93 = vmulps_avx512vl(local_520,auVar53);
        auVar104 = vmulps_avx512vl(local_540,auVar53);
        auVar63._4_4_ = uStack_55c;
        auVar63._0_4_ = local_560;
        auVar63._8_4_ = uStack_558;
        auVar63._12_4_ = uStack_554;
        auVar63._16_4_ = uStack_550;
        auVar63._20_4_ = uStack_54c;
        auVar63._24_4_ = uStack_548;
        auVar63._28_4_ = uStack_544;
        auVar90 = vmulps_avx512vl(auVar63,auVar53);
        auVar100 = vfmadd213ps_avx512vl(auVar96,auVar55,auVar102);
        auVar100 = vsubps_avx512vl(auVar93,auVar100);
        auVar93 = vfmadd213ps_avx512vl(auVar97,auVar55,auVar92);
        auVar91 = vsubps_avx512vl(auVar104,auVar93);
        auVar80 = vfmadd213ps_fma(auVar55,auVar98,auVar103);
        auVar93 = vsubps_avx(auVar90,ZEXT1632(auVar80));
        auVar226 = auVar93._0_28_;
        auVar93 = vfmadd213ps_avx512vl(auVar111,auVar54,auVar95);
        auVar93 = vmulps_avx512vl(auVar101,auVar93);
        auVar95 = vmulps_avx512vl(local_520,auVar54);
        auVar101 = vmulps_avx512vl(local_540,auVar54);
        auVar90 = vmulps_avx512vl(auVar63,auVar54);
        auVar80 = vfmadd213ps_fma(auVar96,auVar93,auVar102);
        auVar104 = vsubps_avx(auVar95,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar97,auVar93,auVar92);
        auVar95 = vsubps_avx512vl(auVar101,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar98,auVar93,auVar103);
        auVar93 = vsubps_avx512vl(auVar90,ZEXT1632(auVar80));
        auVar195 = ZEXT3264(auVar93);
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar186,auVar53);
        bVar8 = (bool)((byte)uVar77 & 1);
        auVar125._0_4_ = (uint)bVar8 * auVar93._0_4_ | (uint)!bVar8 * auVar102._0_4_;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * auVar102._4_4_;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * auVar102._8_4_;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * auVar102._12_4_;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * auVar102._16_4_;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * auVar102._20_4_;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * auVar102._24_4_;
        bVar8 = SUB81(uVar77 >> 7,0);
        auVar125._28_4_ = (uint)bVar8 * auVar93._28_4_ | (uint)!bVar8 * auVar102._28_4_;
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar187,auVar54);
        bVar8 = (bool)((byte)uVar77 & 1);
        auVar126._0_4_ = (uint)bVar8 * auVar93._0_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = SUB81(uVar77 >> 7,0);
        auVar126._28_4_ = (uint)bVar8 * auVar93._28_4_ | (uint)!bVar8 * -0x800000;
        auVar220._8_4_ = 0x7fffffff;
        auVar220._0_8_ = 0x7fffffff7fffffff;
        auVar220._12_4_ = 0x7fffffff;
        auVar220._16_4_ = 0x7fffffff;
        auVar220._20_4_ = 0x7fffffff;
        auVar220._24_4_ = 0x7fffffff;
        auVar220._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar220,local_6e0);
        auVar93 = vmaxps_avx(local_480,auVar93);
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar93 = vmulps_avx512vl(auVar93,auVar34);
        auVar96 = vandps_avx(auVar105,auVar220);
        uVar71 = vcmpps_avx512vl(auVar96,auVar93,1);
        uVar77 = uVar77 & uVar71;
        bVar72 = (byte)uVar77;
        if (bVar72 != 0) {
          uVar71 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar81),2);
          auVar221._8_4_ = 0xff800000;
          auVar221._0_8_ = 0xff800000ff800000;
          auVar221._12_4_ = 0xff800000;
          auVar221._16_4_ = 0xff800000;
          auVar221._20_4_ = 0xff800000;
          auVar221._24_4_ = 0xff800000;
          auVar221._28_4_ = 0xff800000;
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar232,auVar221);
          bVar70 = (byte)uVar71;
          uVar78 = (uint)(bVar70 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
          bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
          uVar128 = (uint)bVar8 * auVar96._4_4_ | (uint)!bVar8 * auVar93._4_4_;
          bVar8 = (bool)((byte)(uVar71 >> 2) & 1);
          uVar129 = (uint)bVar8 * auVar96._8_4_ | (uint)!bVar8 * auVar93._8_4_;
          bVar8 = (bool)((byte)(uVar71 >> 3) & 1);
          uVar130 = (uint)bVar8 * auVar96._12_4_ | (uint)!bVar8 * auVar93._12_4_;
          bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
          uVar131 = (uint)bVar8 * auVar96._16_4_ | (uint)!bVar8 * auVar93._16_4_;
          bVar8 = (bool)((byte)(uVar71 >> 5) & 1);
          uVar132 = (uint)bVar8 * auVar96._20_4_ | (uint)!bVar8 * auVar93._20_4_;
          bVar8 = (bool)((byte)(uVar71 >> 6) & 1);
          uVar133 = (uint)bVar8 * auVar96._24_4_ | (uint)!bVar8 * auVar93._24_4_;
          bVar8 = SUB81(uVar71 >> 7,0);
          uVar134 = (uint)bVar8 * auVar96._28_4_ | (uint)!bVar8 * auVar93._28_4_;
          auVar125._0_4_ = (bVar72 & 1) * uVar78 | !(bool)(bVar72 & 1) * auVar125._0_4_;
          bVar8 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar125._4_4_ = bVar8 * uVar128 | !bVar8 * auVar125._4_4_;
          bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar125._8_4_ = bVar8 * uVar129 | !bVar8 * auVar125._8_4_;
          bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar125._12_4_ = bVar8 * uVar130 | !bVar8 * auVar125._12_4_;
          bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar125._16_4_ = bVar8 * uVar131 | !bVar8 * auVar125._16_4_;
          bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar125._20_4_ = bVar8 * uVar132 | !bVar8 * auVar125._20_4_;
          bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar125._24_4_ = bVar8 * uVar133 | !bVar8 * auVar125._24_4_;
          bVar8 = SUB81(uVar77 >> 7,0);
          auVar125._28_4_ = bVar8 * uVar134 | !bVar8 * auVar125._28_4_;
          auVar96 = vblendmps_avx512vl(auVar221,auVar232);
          bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          bVar14 = SUB81(uVar71 >> 7,0);
          auVar93._0_4_ =
               (uint)(bVar72 & 1) *
               ((uint)(bVar70 & 1) * auVar96._0_4_ | !(bool)(bVar70 & 1) * uVar78) |
               !(bool)(bVar72 & 1) * auVar126._0_4_;
          bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar93._4_4_ =
               (uint)bVar76 * ((uint)bVar8 * auVar96._4_4_ | !bVar8 * uVar128) |
               !bVar76 * auVar126._4_4_;
          bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar93._8_4_ =
               (uint)bVar8 * ((uint)bVar9 * auVar96._8_4_ | !bVar9 * uVar129) |
               !bVar8 * auVar126._8_4_;
          bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar93._12_4_ =
               (uint)bVar8 * ((uint)bVar10 * auVar96._12_4_ | !bVar10 * uVar130) |
               !bVar8 * auVar126._12_4_;
          bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar93._16_4_ =
               (uint)bVar8 * ((uint)bVar11 * auVar96._16_4_ | !bVar11 * uVar131) |
               !bVar8 * auVar126._16_4_;
          bVar8 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar93._20_4_ =
               (uint)bVar8 * ((uint)bVar12 * auVar96._20_4_ | !bVar12 * uVar132) |
               !bVar8 * auVar126._20_4_;
          bVar8 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar93._24_4_ =
               (uint)bVar8 * ((uint)bVar13 * auVar96._24_4_ | !bVar13 * uVar133) |
               !bVar8 * auVar126._24_4_;
          bVar8 = SUB81(uVar77 >> 7,0);
          auVar93._28_4_ =
               (uint)bVar8 * ((uint)bVar14 * auVar96._28_4_ | !bVar14 * uVar134) |
               !bVar8 * auVar126._28_4_;
          bVar74 = (~bVar72 | bVar70) & bVar74;
          auVar126 = auVar93;
        }
      }
      auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar206 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar214._4_4_ = uVar206;
      auVar214._0_4_ = uVar206;
      auVar214._8_4_ = uVar206;
      auVar214._12_4_ = uVar206;
      auVar214._16_4_ = uVar206;
      auVar214._20_4_ = uVar206;
      auVar214._24_4_ = uVar206;
      auVar214._28_4_ = uVar206;
      uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar222._4_4_ = uVar206;
      auVar222._0_4_ = uVar206;
      auVar222._8_4_ = uVar206;
      auVar222._12_4_ = uVar206;
      auVar222._16_4_ = uVar206;
      auVar222._20_4_ = uVar206;
      auVar222._24_4_ = uVar206;
      auVar222._28_4_ = uVar206;
      fVar211 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar210._0_4_ = fVar211 * auVar195._0_4_;
      auVar210._4_4_ = fVar211 * auVar195._4_4_;
      auVar210._8_4_ = fVar211 * auVar195._8_4_;
      auVar210._12_4_ = fVar211 * auVar195._12_4_;
      auVar210._16_4_ = fVar211 * auVar195._16_4_;
      auVar210._20_4_ = fVar211 * auVar195._20_4_;
      auVar210._28_36_ = auVar195._28_36_;
      auVar210._24_4_ = fVar211 * auVar195._24_4_;
      auVar80 = vfmadd231ps_fma(auVar210._0_32_,auVar222,auVar95);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar214,auVar104);
      _local_460 = _local_5c0;
      local_440 = vminps_avx(local_400,auVar125);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar230,ZEXT1632(auVar80));
      auVar205 = ZEXT3264(auVar95);
      _local_420 = vmaxps_avx(_local_5c0,auVar126);
      auVar189._8_4_ = 0x3e99999a;
      auVar189._0_8_ = 0x3e99999a3e99999a;
      auVar189._12_4_ = 0x3e99999a;
      auVar189._16_4_ = 0x3e99999a;
      auVar189._20_4_ = 0x3e99999a;
      auVar189._24_4_ = 0x3e99999a;
      auVar189._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar95,auVar189,1);
      local_784 = (int)uVar16;
      uVar16 = vcmpps_avx512vl(_local_5c0,local_440,2);
      bVar72 = (byte)uVar16 & bVar69;
      _local_580 = _local_420;
      uVar17 = vcmpps_avx512vl(_local_420,local_400,2);
      if ((bVar69 & ((byte)uVar17 | (byte)uVar16)) != 0) {
        auVar56._4_4_ = auVar226._4_4_ * fVar211;
        auVar56._0_4_ = auVar226._0_4_ * fVar211;
        auVar56._8_4_ = auVar226._8_4_ * fVar211;
        auVar56._12_4_ = auVar226._12_4_ * fVar211;
        auVar56._16_4_ = auVar226._16_4_ * fVar211;
        auVar56._20_4_ = auVar226._20_4_ * fVar211;
        auVar56._24_4_ = auVar226._24_4_ * fVar211;
        auVar56._28_4_ = 0x3e99999a;
        auVar80 = vfmadd213ps_fma(auVar91,auVar222,auVar56);
        auVar80 = vfmadd213ps_fma(auVar100,auVar214,ZEXT1632(auVar80));
        auVar93 = vandps_avx(auVar230,ZEXT1632(auVar80));
        uVar16 = vcmpps_avx512vl(auVar93,auVar189,1);
        local_78c = (uint)(byte)~bVar74;
        bVar74 = (byte)uVar16 | ~bVar74;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar148,auVar35);
        local_3e0._0_4_ = (uint)(bVar74 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar8 = (bool)(bVar74 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * 2;
        local_3e0._28_4_ = (uint)(bVar74 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_4a0,local_3e0,5);
        local_788 = (uint)bVar72;
        bVar72 = (byte)uVar16 & bVar72;
        auVar196._8_4_ = 0x7fffffff;
        auVar196._0_8_ = 0x7fffffff7fffffff;
        auVar196._12_4_ = 0x7fffffff;
        auVar205 = ZEXT1664(auVar196);
        if (bVar72 != 0) {
          auVar81 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar80 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar79 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar82 = vminps_avx(auVar81,auVar79);
          auVar81 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar79 = vmaxps_avx(auVar80,auVar81);
          auVar80 = vandps_avx(auVar82,auVar196);
          auVar81 = vandps_avx(auVar79,auVar196);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar211 = auVar80._0_4_ * 1.9073486e-06;
          local_6c0 = vshufps_avx(auVar79,auVar79,0xff);
          local_500 = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
          fStack_4fc = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
          fStack_4f8 = fStack_5b8 + fStack_598;
          fStack_4f4 = fStack_5b4 + fStack_594;
          fStack_4f0 = fStack_5b0 + fStack_590;
          fStack_4ec = fStack_5ac + fStack_58c;
          fStack_4e8 = fStack_5a8 + fStack_588;
          fStack_4e4 = fStack_5a4 + fStack_584;
          _local_5c0 = auVar94;
          do {
            auVar96 = local_880;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar149,_local_5c0);
            auVar127._0_4_ =
                 (uint)(bVar72 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar72 >> 6 & 1);
            auVar127._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * 0x7f800000;
            auVar127._28_4_ =
                 (uint)(bVar72 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
            auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar93 = vminps_avx(auVar127,auVar93);
            auVar95 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar95);
            auVar95 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar95);
            uVar16 = vcmpps_avx512vl(auVar127,auVar93,0);
            bVar70 = (byte)uVar16 & bVar72;
            bVar74 = bVar72;
            if (bVar70 != 0) {
              bVar74 = bVar70;
            }
            iVar19 = 0;
            for (uVar78 = (uint)bVar74; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            auVar225 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar19 << 2)));
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_6e0._0_16_ = (undefined1  [16])aVar1;
            auVar80 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar80._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar19 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_460 + (uint)(iVar19 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar72;
              local_880._2_30_ = auVar96._2_30_;
              fVar215 = sqrtf(auVar80._0_4_);
              bVar72 = local_880[0];
              auVar225 = ZEXT1664(local_820._0_16_);
              auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar135 = (float)local_840._0_4_;
              uVar206 = local_840._4_4_;
              uVar227 = local_840._8_4_;
              uVar228 = local_840._12_4_;
            }
            else {
              auVar80 = vsqrtss_avx(auVar80,auVar80);
              fVar215 = auVar80._0_4_;
              fVar135 = *(float *)(local_460 + (uint)(iVar19 << 2));
              uVar206 = 0;
              uVar227 = 0;
              uVar228 = 0;
            }
            lVar75 = 4;
            do {
              auVar93 = local_840;
              auVar136._4_4_ = fVar135;
              auVar136._0_4_ = fVar135;
              auVar136._8_4_ = fVar135;
              auVar136._12_4_ = fVar135;
              auVar83 = auVar234._0_16_;
              auVar81 = vfmadd132ps_fma(auVar136,auVar83,local_6e0._0_16_);
              fVar229 = auVar225._0_4_;
              fVar216 = 1.0 - fVar229;
              auVar176._0_4_ = local_620._0_4_ * fVar229;
              auVar176._4_4_ = local_620._4_4_ * fVar229;
              auVar176._8_4_ = local_620._8_4_ * fVar229;
              auVar176._12_4_ = local_620._12_4_ * fVar229;
              local_660 = ZEXT416((uint)fVar216);
              auVar192._4_4_ = fVar216;
              auVar192._0_4_ = fVar216;
              auVar192._8_4_ = fVar216;
              auVar192._12_4_ = fVar216;
              auVar80 = vfmadd231ps_fma(auVar176,auVar192,local_5e0._0_16_);
              auVar197._0_4_ = local_600._0_4_ * fVar229;
              auVar197._4_4_ = local_600._4_4_ * fVar229;
              auVar197._8_4_ = local_600._8_4_ * fVar229;
              auVar197._12_4_ = local_600._12_4_ * fVar229;
              auVar79 = vfmadd231ps_fma(auVar197,auVar192,local_620._0_16_);
              auVar208._0_4_ = fVar229 * (float)local_640._0_4_;
              auVar208._4_4_ = fVar229 * (float)local_640._4_4_;
              auVar208._8_4_ = fVar229 * fStack_638;
              auVar208._12_4_ = fVar229 * fStack_634;
              auVar82 = vfmadd231ps_fma(auVar208,auVar192,local_600._0_16_);
              auVar212._0_4_ = fVar229 * auVar79._0_4_;
              auVar212._4_4_ = fVar229 * auVar79._4_4_;
              auVar212._8_4_ = fVar229 * auVar79._8_4_;
              auVar212._12_4_ = fVar229 * auVar79._12_4_;
              auVar80 = vfmadd231ps_fma(auVar212,auVar192,auVar80);
              auVar177._0_4_ = fVar229 * auVar82._0_4_;
              auVar177._4_4_ = fVar229 * auVar82._4_4_;
              auVar177._8_4_ = fVar229 * auVar82._8_4_;
              auVar177._12_4_ = fVar229 * auVar82._12_4_;
              auVar79 = vfmadd231ps_fma(auVar177,auVar192,auVar79);
              auVar198._0_4_ = fVar229 * auVar79._0_4_;
              auVar198._4_4_ = fVar229 * auVar79._4_4_;
              auVar198._8_4_ = fVar229 * auVar79._8_4_;
              auVar198._12_4_ = fVar229 * auVar79._12_4_;
              local_650 = vfmadd231ps_fma(auVar198,auVar80,auVar192);
              auVar80 = vsubps_avx(auVar79,auVar80);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar79 = vmulps_avx512vl(auVar80,auVar20);
              auVar80 = vsubps_avx(auVar81,local_650);
              local_700._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_880._0_16_ = auVar79;
              local_720._0_16_ = auVar80;
              local_820._0_16_ = auVar225._0_16_;
              local_840._4_4_ = uVar206;
              local_840._0_4_ = fVar135;
              local_840._8_4_ = uVar227;
              local_840._16_16_ = auVar93._16_16_;
              local_840._12_4_ = uVar228;
              if (auVar80._0_4_ < 0.0) {
                auVar225._0_4_ = sqrtf(auVar80._0_4_);
                auVar225._4_60_ = extraout_var;
                auVar83 = ZEXT816(0) << 0x40;
                auVar80 = auVar225._0_16_;
                auVar79 = local_880._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_670 = vdpps_avx(auVar79,auVar79,0x7f);
              fVar135 = local_670._0_4_;
              auVar157._4_12_ = auVar83._4_12_;
              auVar157._0_4_ = fVar135;
              local_7e0 = vrsqrt14ss_avx512f(auVar83,auVar157);
              fVar216 = local_7e0._0_4_;
              local_680 = vrcp14ss_avx512f(auVar83,auVar157);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(local_670,auVar21);
              auVar81 = vfnmadd213ss_fma(local_680,local_670,ZEXT416(0x40000000));
              uVar78 = auVar80._0_4_;
              if (fVar135 < auVar82._0_4_) {
                local_7f0._0_4_ = fVar135 * -0.5;
                auVar153._0_4_ = sqrtf(fVar135);
                auVar153._4_60_ = extraout_var_00;
                auVar80 = ZEXT416(uVar78);
                auVar83 = ZEXT816(0) << 0x40;
                auVar82 = auVar153._0_16_;
                fVar135 = (float)local_7f0._0_4_;
                auVar79 = local_880._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx512f(local_670,local_670);
                fVar135 = fVar135 * -0.5;
              }
              fVar229 = local_7e0._0_4_;
              fVar135 = fVar216 * 1.5 + fVar135 * fVar229 * fVar229 * fVar229;
              local_7e0._0_4_ = auVar79._0_4_ * fVar135;
              local_7e0._4_4_ = auVar79._4_4_ * fVar135;
              local_7e0._8_4_ = auVar79._8_4_ * fVar135;
              local_7e0._12_4_ = auVar79._12_4_ * fVar135;
              auVar88 = vdpps_avx(local_700._0_16_,local_7e0,0x7f);
              fVar229 = auVar80._0_4_;
              auVar137._0_4_ = auVar88._0_4_ * auVar88._0_4_;
              auVar137._4_4_ = auVar88._4_4_ * auVar88._4_4_;
              auVar137._8_4_ = auVar88._8_4_ * auVar88._8_4_;
              auVar137._12_4_ = auVar88._12_4_ * auVar88._12_4_;
              auVar3 = vsubps_avx(local_720._0_16_,auVar137);
              fVar216 = auVar3._0_4_;
              auVar158._4_12_ = auVar83._4_12_;
              auVar158._0_4_ = fVar216;
              auVar83 = vrsqrt14ss_avx512f(auVar83,auVar158);
              auVar84 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              auVar85 = vmulss_avx512f(auVar3,ZEXT416(0xbf000000));
              if (fVar216 < 0.0) {
                local_7f0 = auVar88;
                local_6a0 = fVar135;
                fStack_69c = fVar135;
                fStack_698 = fVar135;
                fStack_694 = fVar135;
                local_690 = auVar83;
                fVar216 = sqrtf(fVar216);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar80 = ZEXT416(uVar78);
                auVar88 = local_7f0;
                auVar79 = local_880._0_16_;
                auVar83 = local_690;
                fVar135 = local_6a0;
                fVar156 = fStack_69c;
                fVar217 = fStack_698;
                fVar218 = fStack_694;
              }
              else {
                auVar3 = vsqrtss_avx(auVar3,auVar3);
                fVar216 = auVar3._0_4_;
                fVar156 = fVar135;
                fVar217 = fVar135;
                fVar218 = fVar135;
              }
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_660);
              fVar191 = auVar3._0_4_ * 6.0;
              fVar15 = local_820._0_4_ * 6.0;
              auVar178._0_4_ = fVar15 * (float)local_640._0_4_;
              auVar178._4_4_ = fVar15 * (float)local_640._4_4_;
              auVar178._8_4_ = fVar15 * fStack_638;
              auVar178._12_4_ = fVar15 * fStack_634;
              auVar159._4_4_ = fVar191;
              auVar159._0_4_ = fVar191;
              auVar159._8_4_ = fVar191;
              auVar159._12_4_ = fVar191;
              auVar3 = vfmadd132ps_fma(auVar159,auVar178,local_600._0_16_);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_660,local_820._0_16_);
              fVar191 = auVar87._0_4_ * 6.0;
              auVar179._4_4_ = fVar191;
              auVar179._0_4_ = fVar191;
              auVar179._8_4_ = fVar191;
              auVar179._12_4_ = fVar191;
              auVar3 = vfmadd132ps_fma(auVar179,auVar3,local_620._0_16_);
              fVar191 = local_660._0_4_ * 6.0;
              auVar160._4_4_ = fVar191;
              auVar160._0_4_ = fVar191;
              auVar160._8_4_ = fVar191;
              auVar160._12_4_ = fVar191;
              auVar3 = vfmadd132ps_fma(auVar160,auVar3,local_5e0._0_16_);
              auVar180._0_4_ = auVar3._0_4_ * (float)local_670._0_4_;
              auVar180._4_4_ = auVar3._4_4_ * (float)local_670._0_4_;
              auVar180._8_4_ = auVar3._8_4_ * (float)local_670._0_4_;
              auVar180._12_4_ = auVar3._12_4_ * (float)local_670._0_4_;
              auVar3 = vdpps_avx(auVar79,auVar3,0x7f);
              fVar191 = auVar3._0_4_;
              auVar161._0_4_ = auVar79._0_4_ * fVar191;
              auVar161._4_4_ = auVar79._4_4_ * fVar191;
              auVar161._8_4_ = auVar79._8_4_ * fVar191;
              auVar161._12_4_ = auVar79._12_4_ * fVar191;
              auVar3 = vsubps_avx(auVar180,auVar161);
              fVar191 = auVar81._0_4_ * (float)local_680._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar79,auVar22);
              auVar199._0_4_ = fVar135 * auVar3._0_4_ * fVar191;
              auVar199._4_4_ = fVar156 * auVar3._4_4_ * fVar191;
              auVar199._8_4_ = fVar217 * auVar3._8_4_ * fVar191;
              auVar199._12_4_ = fVar218 * auVar3._12_4_ * fVar191;
              auVar81 = vdpps_avx(auVar86,local_7e0,0x7f);
              auVar3 = vmaxss_avx(ZEXT416((uint)fVar211),
                                  ZEXT416((uint)((float)local_840._0_4_ * fVar215 * 1.9073486e-06)))
              ;
              auVar87 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar82);
              auVar82 = vdpps_avx(local_700._0_16_,auVar199,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar211),auVar3);
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 + 1.0)),auVar87,auVar80);
              auVar80 = vdpps_avx(local_6e0._0_16_,local_7e0,0x7f);
              fVar135 = auVar81._0_4_ + auVar82._0_4_;
              auVar81 = vdpps_avx(local_700._0_16_,auVar86,0x7f);
              auVar85 = vmulss_avx512f(auVar85,auVar83);
              auVar83 = vmulss_avx512f(auVar83,auVar83);
              auVar82 = vdpps_avx(local_700._0_16_,local_6e0._0_16_,0x7f);
              auVar85 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar85._0_4_ * auVar83._0_4_)));
              auVar83 = vfnmadd231ss_fma(auVar81,auVar88,ZEXT416((uint)fVar135));
              auVar84 = vfnmadd231ss_fma(auVar82,auVar88,auVar80);
              auVar81 = vpermilps_avx(local_650,0xff);
              fVar216 = fVar216 - auVar81._0_4_;
              auVar81 = vshufps_avx(auVar79,auVar79,0xff);
              auVar82 = vfmsub213ss_fma(auVar83,auVar85,auVar81);
              fVar229 = auVar84._0_4_ * auVar85._0_4_;
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar135),ZEXT416((uint)fVar229));
              fVar156 = auVar83._0_4_;
              fVar229 = local_820._0_4_ -
                        (auVar88._0_4_ * (fVar229 / fVar156) - fVar216 * (auVar80._0_4_ / fVar156));
              auVar225 = ZEXT464((uint)fVar229);
              fVar135 = (float)local_840._0_4_ -
                        (fVar216 * (fVar135 / fVar156) - auVar88._0_4_ * (auVar82._0_4_ / fVar156));
              uVar206 = 0;
              uVar227 = 0;
              uVar228 = 0;
              auVar200._8_4_ = 0x7fffffff;
              auVar200._0_8_ = 0x7fffffff7fffffff;
              auVar200._12_4_ = 0x7fffffff;
              auVar205 = ZEXT1664(auVar200);
              auVar80 = vandps_avx(auVar88,auVar200);
              if (auVar87._0_4_ <= auVar80._0_4_) {
                bVar8 = false;
                auVar234 = ZEXT864(0) << 0x20;
              }
              else {
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar3._0_4_)),local_6c0,
                                          ZEXT416(0x36000000));
                auVar80 = vandps_avx(ZEXT416((uint)fVar216),auVar200);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                auVar234 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar82._0_4_ <= auVar80._0_4_) {
                  bVar8 = false;
                }
                else {
                  fVar135 = fVar135 + (float)local_6b0._0_4_;
                  uVar206 = 0;
                  uVar227 = 0;
                  uVar228 = 0;
                  bVar8 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar135) &&
                       (fVar216 = (ray->super_RayK<1>).tfar, fVar135 <= fVar216)) &&
                      (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                    auVar80 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)local_720._0_4_));
                    fVar156 = auVar80._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_888].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar156 = fVar156 * 1.5 + local_720._0_4_ * -0.5 * fVar156 * fVar156 * fVar156
                      ;
                      auVar162._0_4_ = local_700._0_4_ * fVar156;
                      auVar162._4_4_ = local_700._4_4_ * fVar156;
                      auVar162._8_4_ = local_700._8_4_ * fVar156;
                      auVar162._12_4_ = local_700._12_4_ * fVar156;
                      auVar82 = vfmadd213ps_fma(auVar81,auVar162,auVar79);
                      auVar80 = vshufps_avx(auVar162,auVar162,0xc9);
                      auVar81 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar163._0_4_ = auVar162._0_4_ * auVar81._0_4_;
                      auVar163._4_4_ = auVar162._4_4_ * auVar81._4_4_;
                      auVar163._8_4_ = auVar162._8_4_ * auVar81._8_4_;
                      auVar163._12_4_ = auVar162._12_4_ * auVar81._12_4_;
                      auVar79 = vfmsub231ps_fma(auVar163,auVar79,auVar80);
                      auVar80 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar81 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                      auVar138._0_4_ = auVar82._0_4_ * auVar79._0_4_;
                      auVar138._4_4_ = auVar82._4_4_ * auVar79._4_4_;
                      auVar138._8_4_ = auVar82._8_4_ * auVar79._8_4_;
                      auVar138._12_4_ = auVar82._12_4_ * auVar79._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar138,auVar80,auVar81);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar135;
                        auVar81 = vshufps_avx(auVar80,auVar80,0xe9);
                        uVar16 = vmovlps_avx(auVar81);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar16;
                        (ray->Ng).field_0.field_0.z = auVar80._0_4_;
                        ray->u = fVar229;
                        ray->v = 0.0;
                        ray->primID = (uint)local_848;
                        ray->geomID = (uint)local_888;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar81 = vshufps_avx(auVar80,auVar80,0xe9);
                        local_770 = vmovlps_avx(auVar81);
                        local_768 = auVar80._0_4_;
                        local_764 = fVar229;
                        local_760 = 0;
                        local_75c = (uint)local_848;
                        local_758 = (uint)local_888;
                        local_754 = context->user->instID[0];
                        local_750 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar135;
                        local_88c = -1;
                        local_7c0.valid = &local_88c;
                        local_7c0.geometryUserPtr = pGVar5->userPtr;
                        local_7c0.context = context->user;
                        local_7c0.ray = (RTCRayN *)ray;
                        local_7c0.hit = (RTCHitN *)&local_770;
                        local_7c0.N = 1;
                        local_820._0_16_ = ZEXT416((uint)fVar229);
                        local_840._0_16_ = ZEXT416((uint)fVar135);
                        local_880._0_4_ = fVar216;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d700b7:
                          p_Var7 = context->args->filter;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var7)(&local_7c0);
                              auVar225 = ZEXT1664(local_820._0_16_);
                              auVar205 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar216 = (float)local_880._0_4_;
                              fVar135 = (float)local_840._0_4_;
                              uVar206 = local_840._4_4_;
                              uVar227 = local_840._8_4_;
                              uVar228 = local_840._12_4_;
                            }
                            if (*local_7c0.valid == 0) goto LAB_01d70170;
                          }
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_7c0.hit;
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_7c0.hit + 4);
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_7c0.hit + 8);
                          *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc);
                          *(float *)((long)local_7c0.ray + 0x40) = *(float *)(local_7c0.hit + 0x10);
                          *(float *)((long)local_7c0.ray + 0x44) = *(float *)(local_7c0.hit + 0x14);
                          *(float *)((long)local_7c0.ray + 0x48) = *(float *)(local_7c0.hit + 0x18);
                          *(float *)((long)local_7c0.ray + 0x4c) = *(float *)(local_7c0.hit + 0x1c);
                          *(float *)((long)local_7c0.ray + 0x50) = *(float *)(local_7c0.hit + 0x20);
                        }
                        else {
                          (*pGVar5->intersectionFilterN)(&local_7c0);
                          auVar225 = ZEXT1664(local_820._0_16_);
                          auVar205 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar216 = (float)local_880._0_4_;
                          fVar135 = (float)local_840._0_4_;
                          uVar206 = local_840._4_4_;
                          uVar227 = local_840._8_4_;
                          uVar228 = local_840._12_4_;
                          if (*local_7c0.valid != 0) goto LAB_01d700b7;
LAB_01d70170:
                          (ray->super_RayK<1>).tfar = fVar216;
                        }
                      }
                    }
                  }
                }
              }
              bVar76 = lVar75 != 0;
              lVar75 = lVar75 + -1;
            } while ((!bVar8) && (bVar76));
            auVar64._4_4_ = fStack_4fc;
            auVar64._0_4_ = local_500;
            auVar64._8_4_ = fStack_4f8;
            auVar64._12_4_ = fStack_4f4;
            auVar64._16_4_ = fStack_4f0;
            auVar64._20_4_ = fStack_4ec;
            auVar64._24_4_ = fStack_4e8;
            auVar64._28_4_ = fStack_4e4;
            fVar135 = (ray->super_RayK<1>).tfar;
            auVar36._4_4_ = fVar135;
            auVar36._0_4_ = fVar135;
            auVar36._8_4_ = fVar135;
            auVar36._12_4_ = fVar135;
            auVar36._16_4_ = fVar135;
            auVar36._20_4_ = fVar135;
            auVar36._24_4_ = fVar135;
            auVar36._28_4_ = fVar135;
            uVar16 = vcmpps_avx512vl(auVar64,auVar36,2);
            bVar72 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar72 & (byte)uVar16;
          } while (bVar72 != 0);
        }
        auVar150._0_4_ = (float)local_580._0_4_ + (float)local_5a0._0_4_;
        auVar150._4_4_ = (float)local_580._4_4_ + (float)local_5a0._4_4_;
        auVar150._8_4_ = fStack_578 + fStack_598;
        auVar150._12_4_ = fStack_574 + fStack_594;
        auVar150._16_4_ = fStack_570 + fStack_590;
        auVar150._20_4_ = fStack_56c + fStack_58c;
        auVar150._24_4_ = fStack_568 + fStack_588;
        auVar150._28_4_ = fStack_564 + fStack_584;
        fVar211 = (ray->super_RayK<1>).tfar;
        auVar37._4_4_ = fVar211;
        auVar37._0_4_ = fVar211;
        auVar37._8_4_ = fVar211;
        auVar37._12_4_ = fVar211;
        auVar37._16_4_ = fVar211;
        auVar37._20_4_ = fVar211;
        auVar37._24_4_ = fVar211;
        auVar37._28_4_ = fVar211;
        uVar16 = vcmpps_avx512vl(auVar150,auVar37,2);
        bVar74 = (byte)local_784 | (byte)local_78c;
        bVar69 = (byte)uVar17 & bVar69 & (byte)uVar16;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar151,auVar38);
        auVar93._0_4_ = (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar8 = (bool)(bVar74 >> 1 & 1);
        auVar93._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 2 & 1);
        auVar93._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 3 & 1);
        auVar93._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 4 & 1);
        auVar93._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 5 & 1);
        auVar93._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar74 >> 6 & 1);
        auVar93._24_4_ = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * 2;
        auVar93._28_4_ = (uint)(bVar74 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
        _local_580 = auVar93;
        uVar16 = vpcmpd_avx512vl(auVar93,local_4a0,2);
        bVar74 = (byte)uVar16 & bVar69;
        if (bVar74 != 0) {
          auVar81 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar80 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar79 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar82 = vminps_avx(auVar81,auVar79);
          auVar81 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar79 = vmaxps_avx(auVar80,auVar81);
          auVar80 = vandps_avx(auVar82,auVar205._0_16_);
          auVar81 = vandps_avx(auVar79,auVar205._0_16_);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar211 = auVar80._0_4_ * 1.9073486e-06;
          local_6c0 = vshufps_avx(auVar79,auVar79,0xff);
          _local_5c0 = _local_420;
          local_500 = (float)local_420._0_4_ + (float)local_5a0._0_4_;
          fStack_4fc = (float)local_420._4_4_ + (float)local_5a0._4_4_;
          fStack_4f8 = fStack_418 + fStack_598;
          fStack_4f4 = fStack_414 + fStack_594;
          fStack_4f0 = fStack_410 + fStack_590;
          fStack_4ec = fStack_40c + fStack_58c;
          fStack_4e8 = fStack_408 + fStack_588;
          fStack_4e4 = fStack_404 + fStack_584;
          do {
            auVar97 = local_880;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar95 = vblendmps_avx512vl(auVar152,_local_5c0);
            auVar93._0_4_ =
                 (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 1 & 1);
            auVar93._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 2 & 1);
            auVar93._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 3 & 1);
            auVar93._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 4 & 1);
            auVar93._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 5 & 1);
            auVar93._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar74 >> 6 & 1);
            auVar93._24_4_ = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * 0x7f800000;
            auVar93._28_4_ =
                 (uint)(bVar74 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
            auVar95 = vshufps_avx(auVar93,auVar93,0xb1);
            auVar95 = vminps_avx(auVar93,auVar95);
            auVar96 = vshufpd_avx(auVar95,auVar95,5);
            auVar95 = vminps_avx(auVar95,auVar96);
            auVar96 = vpermpd_avx2(auVar95,0x4e);
            auVar95 = vminps_avx(auVar95,auVar96);
            uVar16 = vcmpps_avx512vl(auVar93,auVar95,0);
            bVar70 = (byte)uVar16 & bVar74;
            bVar72 = bVar74;
            if (bVar70 != 0) {
              bVar72 = bVar70;
            }
            iVar19 = 0;
            for (uVar78 = (uint)bVar72; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            auVar225 = ZEXT464(*(uint *)(local_4e0 + (uint)(iVar19 << 2)));
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_6e0._0_16_ = (undefined1  [16])aVar1;
            auVar80 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar80._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar19 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_400 + (uint)(iVar19 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar74;
              local_880._2_30_ = auVar97._2_30_;
              fVar215 = sqrtf(auVar80._0_4_);
              bVar74 = local_880[0];
              auVar225 = ZEXT1664(local_820._0_16_);
              auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar135 = (float)local_840._0_4_;
              uVar206 = local_840._4_4_;
              uVar227 = local_840._8_4_;
              uVar228 = local_840._12_4_;
            }
            else {
              auVar80 = vsqrtss_avx(auVar80,auVar80);
              fVar215 = auVar80._0_4_;
              fVar135 = *(float *)(local_400 + (uint)(iVar19 << 2));
              uVar206 = 0;
              uVar227 = 0;
              uVar228 = 0;
            }
            lVar75 = 4;
            do {
              auVar95 = local_840;
              auVar139._4_4_ = fVar135;
              auVar139._0_4_ = fVar135;
              auVar139._8_4_ = fVar135;
              auVar139._12_4_ = fVar135;
              auVar83 = auVar234._0_16_;
              auVar81 = vfmadd132ps_fma(auVar139,auVar83,local_6e0._0_16_);
              fVar229 = auVar225._0_4_;
              fVar216 = 1.0 - fVar229;
              auVar181._0_4_ = local_620._0_4_ * fVar229;
              auVar181._4_4_ = local_620._4_4_ * fVar229;
              auVar181._8_4_ = local_620._8_4_ * fVar229;
              auVar181._12_4_ = local_620._12_4_ * fVar229;
              local_660 = ZEXT416((uint)fVar216);
              auVar193._4_4_ = fVar216;
              auVar193._0_4_ = fVar216;
              auVar193._8_4_ = fVar216;
              auVar193._12_4_ = fVar216;
              auVar80 = vfmadd231ps_fma(auVar181,auVar193,local_5e0._0_16_);
              auVar201._0_4_ = local_600._0_4_ * fVar229;
              auVar201._4_4_ = local_600._4_4_ * fVar229;
              auVar201._8_4_ = local_600._8_4_ * fVar229;
              auVar201._12_4_ = local_600._12_4_ * fVar229;
              auVar79 = vfmadd231ps_fma(auVar201,auVar193,local_620._0_16_);
              auVar209._0_4_ = fVar229 * (float)local_640._0_4_;
              auVar209._4_4_ = fVar229 * (float)local_640._4_4_;
              auVar209._8_4_ = fVar229 * fStack_638;
              auVar209._12_4_ = fVar229 * fStack_634;
              auVar82 = vfmadd231ps_fma(auVar209,auVar193,local_600._0_16_);
              auVar213._0_4_ = fVar229 * auVar79._0_4_;
              auVar213._4_4_ = fVar229 * auVar79._4_4_;
              auVar213._8_4_ = fVar229 * auVar79._8_4_;
              auVar213._12_4_ = fVar229 * auVar79._12_4_;
              auVar80 = vfmadd231ps_fma(auVar213,auVar193,auVar80);
              auVar182._0_4_ = fVar229 * auVar82._0_4_;
              auVar182._4_4_ = fVar229 * auVar82._4_4_;
              auVar182._8_4_ = fVar229 * auVar82._8_4_;
              auVar182._12_4_ = fVar229 * auVar82._12_4_;
              auVar79 = vfmadd231ps_fma(auVar182,auVar193,auVar79);
              auVar202._0_4_ = fVar229 * auVar79._0_4_;
              auVar202._4_4_ = fVar229 * auVar79._4_4_;
              auVar202._8_4_ = fVar229 * auVar79._8_4_;
              auVar202._12_4_ = fVar229 * auVar79._12_4_;
              local_650 = vfmadd231ps_fma(auVar202,auVar80,auVar193);
              auVar80 = vsubps_avx(auVar79,auVar80);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar82 = auVar93._16_16_;
              auVar79 = vmulps_avx512vl(auVar80,auVar23);
              auVar80 = vsubps_avx(auVar81,local_650);
              local_700._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_880._0_16_ = auVar79;
              local_720._0_16_ = auVar80;
              local_820._0_16_ = auVar225._0_16_;
              local_840._4_4_ = uVar206;
              local_840._0_4_ = fVar135;
              local_840._8_4_ = uVar227;
              local_840._16_16_ = auVar95._16_16_;
              local_840._12_4_ = uVar228;
              if (auVar80._0_4_ < 0.0) {
                auVar154._0_4_ = sqrtf(auVar80._0_4_);
                auVar154._4_60_ = extraout_var_01;
                auVar83 = ZEXT816(0) << 0x40;
                auVar80 = auVar154._0_16_;
                auVar79 = local_880._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_670 = vdpps_avx(auVar79,auVar79,0x7f);
              fVar135 = local_670._0_4_;
              auVar164._4_12_ = auVar83._4_12_;
              auVar164._0_4_ = fVar135;
              local_7e0 = vrsqrt14ss_avx512f(auVar83,auVar164);
              fVar216 = local_7e0._0_4_;
              local_680 = vrcp14ss_avx512f(auVar83,auVar164);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_670,auVar24);
              auVar81 = vfnmadd213ss_fma(local_680,local_670,ZEXT416(0x40000000));
              uVar78 = auVar80._0_4_;
              if (fVar135 < auVar88._0_4_) {
                local_7f0._0_4_ = fVar135 * -0.5;
                auVar155._0_4_ = sqrtf(fVar135);
                auVar155._4_60_ = extraout_var_02;
                auVar80 = ZEXT416(uVar78);
                auVar83 = ZEXT816(0) << 0x40;
                auVar88 = auVar155._0_16_;
                fVar135 = (float)local_7f0._0_4_;
                auVar79 = local_880._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_670,local_670);
                fVar135 = fVar135 * -0.5;
              }
              fVar229 = local_7e0._0_4_;
              fVar135 = fVar216 * 1.5 + fVar135 * fVar229 * fVar229 * fVar229;
              local_7e0._0_4_ = auVar79._0_4_ * fVar135;
              local_7e0._4_4_ = auVar79._4_4_ * fVar135;
              local_7e0._8_4_ = auVar79._8_4_ * fVar135;
              local_7e0._12_4_ = auVar79._12_4_ * fVar135;
              auVar3 = vdpps_avx(local_700._0_16_,local_7e0,0x7f);
              fVar229 = auVar80._0_4_;
              auVar140._0_4_ = auVar3._0_4_ * auVar3._0_4_;
              auVar140._4_4_ = auVar3._4_4_ * auVar3._4_4_;
              auVar140._8_4_ = auVar3._8_4_ * auVar3._8_4_;
              auVar140._12_4_ = auVar3._12_4_ * auVar3._12_4_;
              auVar84 = vsubps_avx(local_720._0_16_,auVar140);
              fVar216 = auVar84._0_4_;
              auVar165._4_12_ = auVar83._4_12_;
              auVar165._0_4_ = fVar216;
              auVar83 = vrsqrt14ss_avx512f(auVar83,auVar165);
              auVar85 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              auVar87 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              if (fVar216 < 0.0) {
                local_7f0 = auVar3;
                local_6a0 = fVar135;
                fStack_69c = fVar135;
                fStack_698 = fVar135;
                fStack_694 = fVar135;
                local_690 = auVar83;
                fVar216 = sqrtf(fVar216);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar80 = ZEXT416(uVar78);
                auVar3 = local_7f0;
                auVar79 = local_880._0_16_;
                auVar83 = local_690;
                fVar135 = local_6a0;
                fVar156 = fStack_69c;
                fVar217 = fStack_698;
                fVar218 = fStack_694;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar216 = auVar84._0_4_;
                fVar156 = fVar135;
                fVar217 = fVar135;
                fVar218 = fVar135;
              }
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_660);
              fVar191 = auVar84._0_4_ * 6.0;
              fVar15 = local_820._0_4_ * 6.0;
              auVar183._0_4_ = fVar15 * (float)local_640._0_4_;
              auVar183._4_4_ = fVar15 * (float)local_640._4_4_;
              auVar183._8_4_ = fVar15 * fStack_638;
              auVar183._12_4_ = fVar15 * fStack_634;
              auVar166._4_4_ = fVar191;
              auVar166._0_4_ = fVar191;
              auVar166._8_4_ = fVar191;
              auVar166._12_4_ = fVar191;
              auVar84 = vfmadd132ps_fma(auVar166,auVar183,local_600._0_16_);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_660,local_820._0_16_);
              fVar191 = auVar86._0_4_ * 6.0;
              auVar184._4_4_ = fVar191;
              auVar184._0_4_ = fVar191;
              auVar184._8_4_ = fVar191;
              auVar184._12_4_ = fVar191;
              auVar84 = vfmadd132ps_fma(auVar184,auVar84,local_620._0_16_);
              fVar191 = local_660._0_4_ * 6.0;
              auVar167._4_4_ = fVar191;
              auVar167._0_4_ = fVar191;
              auVar167._8_4_ = fVar191;
              auVar167._12_4_ = fVar191;
              auVar84 = vfmadd132ps_fma(auVar167,auVar84,local_5e0._0_16_);
              auVar185._0_4_ = auVar84._0_4_ * (float)local_670._0_4_;
              auVar185._4_4_ = auVar84._4_4_ * (float)local_670._0_4_;
              auVar185._8_4_ = auVar84._8_4_ * (float)local_670._0_4_;
              auVar185._12_4_ = auVar84._12_4_ * (float)local_670._0_4_;
              auVar84 = vdpps_avx(auVar79,auVar84,0x7f);
              fVar191 = auVar84._0_4_;
              auVar168._0_4_ = auVar79._0_4_ * fVar191;
              auVar168._4_4_ = auVar79._4_4_ * fVar191;
              auVar168._8_4_ = auVar79._8_4_ * fVar191;
              auVar168._12_4_ = auVar79._12_4_ * fVar191;
              auVar84 = vsubps_avx(auVar185,auVar168);
              fVar191 = auVar81._0_4_ * (float)local_680._0_4_;
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(auVar79,auVar25);
              auVar203._0_4_ = fVar135 * auVar84._0_4_ * fVar191;
              auVar203._4_4_ = fVar156 * auVar84._4_4_ * fVar191;
              auVar203._8_4_ = fVar217 * auVar84._8_4_ * fVar191;
              auVar203._12_4_ = fVar218 * auVar84._12_4_ * fVar191;
              auVar81 = vdpps_avx(auVar89,local_7e0,0x7f);
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar211),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar215 * 1.9073486e-06))
                                  );
              auVar86 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar88);
              auVar88 = vdpps_avx(local_700._0_16_,auVar203,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar211),auVar84);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 + 1.0)),auVar86,auVar80);
              auVar80 = vdpps_avx(local_6e0._0_16_,local_7e0,0x7f);
              fVar135 = auVar81._0_4_ + auVar88._0_4_;
              auVar81 = vdpps_avx(local_700._0_16_,auVar89,0x7f);
              auVar88 = vmulss_avx512f(auVar87,auVar83);
              auVar87 = vmulss_avx512f(auVar83,auVar83);
              auVar83 = vdpps_avx(local_700._0_16_,local_6e0._0_16_,0x7f);
              auVar93._0_16_ =
                   vaddss_avx512f(auVar85,ZEXT416((uint)(auVar88._0_4_ * auVar87._0_4_)));
              auVar93._16_16_ = auVar82;
              auVar88 = vfnmadd231ss_fma(auVar81,auVar3,ZEXT416((uint)fVar135));
              auVar85 = vfnmadd231ss_fma(auVar83,auVar3,auVar80);
              auVar81 = vpermilps_avx(local_650,0xff);
              fVar216 = fVar216 - auVar81._0_4_;
              auVar81 = vshufps_avx(auVar79,auVar79,0xff);
              auVar83 = vfmsub213ss_fma(auVar88,auVar93._0_16_,auVar81);
              fVar229 = auVar85._0_4_ * auVar93._0_4_;
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar135),ZEXT416((uint)fVar229));
              fVar156 = auVar88._0_4_;
              fVar229 = local_820._0_4_ -
                        (auVar3._0_4_ * (fVar229 / fVar156) - fVar216 * (auVar80._0_4_ / fVar156));
              auVar225 = ZEXT464((uint)fVar229);
              fVar135 = (float)local_840._0_4_ -
                        (fVar216 * (fVar135 / fVar156) - auVar3._0_4_ * (auVar83._0_4_ / fVar156));
              uVar206 = 0;
              uVar227 = 0;
              uVar228 = 0;
              auVar204._8_4_ = 0x7fffffff;
              auVar204._0_8_ = 0x7fffffff7fffffff;
              auVar204._12_4_ = 0x7fffffff;
              auVar205 = ZEXT1664(auVar204);
              auVar80 = vandps_avx(auVar3,auVar204);
              if (auVar86._0_4_ <= auVar80._0_4_) {
                bVar8 = false;
                auVar234 = ZEXT864(0) << 0x20;
              }
              else {
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar84._0_4_)),local_6c0,
                                          ZEXT416(0x36000000));
                auVar80 = vandps_avx(ZEXT416((uint)fVar216),auVar204);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                auVar234 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar83._0_4_ <= auVar80._0_4_) {
                  bVar8 = false;
                }
                else {
                  fVar135 = fVar135 + (float)local_6b0._0_4_;
                  uVar206 = 0;
                  uVar227 = 0;
                  uVar228 = 0;
                  bVar8 = true;
                  if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar135) {
                    fVar216 = (ray->super_RayK<1>).tfar;
                    auVar205 = ZEXT464((uint)fVar216);
                    if (((fVar135 <= fVar216) && (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                      auVar93._0_16_ =
                           vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)local_720._0_4_));
                      fVar156 = auVar93._0_4_;
                      pGVar5 = (context->scene->geometries).items[local_888].ptr;
                      if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar156 = fVar156 * 1.5 +
                                  local_720._0_4_ * -0.5 * fVar156 * fVar156 * fVar156;
                        auVar169._0_4_ = local_700._0_4_ * fVar156;
                        auVar169._4_4_ = local_700._4_4_ * fVar156;
                        auVar169._8_4_ = local_700._8_4_ * fVar156;
                        auVar169._12_4_ = local_700._12_4_ * fVar156;
                        auVar82 = vfmadd213ps_fma(auVar81,auVar169,auVar79);
                        auVar80 = vshufps_avx(auVar169,auVar169,0xc9);
                        auVar81 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar170._0_4_ = auVar169._0_4_ * auVar81._0_4_;
                        auVar170._4_4_ = auVar169._4_4_ * auVar81._4_4_;
                        auVar170._8_4_ = auVar169._8_4_ * auVar81._8_4_;
                        auVar170._12_4_ = auVar169._12_4_ * auVar81._12_4_;
                        auVar79 = vfmsub231ps_fma(auVar170,auVar79,auVar80);
                        auVar80 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar81 = vshufps_avx(auVar82,auVar82,0xc9);
                        auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                        auVar141._0_4_ = auVar82._0_4_ * auVar79._0_4_;
                        auVar141._4_4_ = auVar82._4_4_ * auVar79._4_4_;
                        auVar141._8_4_ = auVar82._8_4_ * auVar79._8_4_;
                        auVar141._12_4_ = auVar82._12_4_ * auVar79._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar141,auVar80,auVar81);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar135;
                          auVar81 = vshufps_avx(auVar80,auVar80,0xe9);
                          uVar16 = vmovlps_avx(auVar81);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar16;
                          (ray->Ng).field_0.field_0.z = auVar80._0_4_;
                          ray->u = fVar229;
                          ray->v = 0.0;
                          ray->primID = (uint)local_848;
                          ray->geomID = (uint)local_888;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar81 = vshufps_avx(auVar80,auVar80,0xe9);
                          local_770 = vmovlps_avx(auVar81);
                          local_768 = auVar80._0_4_;
                          local_764 = fVar229;
                          local_760 = 0;
                          local_75c = (uint)local_848;
                          local_758 = (uint)local_888;
                          local_754 = context->user->instID[0];
                          local_750 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar135;
                          local_88c = -1;
                          local_7c0.valid = &local_88c;
                          local_7c0.geometryUserPtr = pGVar5->userPtr;
                          local_7c0.context = context->user;
                          local_7c0.ray = (RTCRayN *)ray;
                          local_7c0.hit = (RTCHitN *)&local_770;
                          local_7c0.N = 1;
                          local_820._0_16_ = ZEXT416((uint)fVar229);
                          local_840._0_16_ = ZEXT416((uint)fVar135);
                          local_880._0_4_ = fVar216;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d70aa3:
                            p_Var7 = context->args->filter;
                            if (p_Var7 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var7)(&local_7c0);
                                auVar205 = ZEXT464((uint)local_880._0_4_);
                                auVar225 = ZEXT1664(local_820._0_16_);
                                auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
                                fVar135 = (float)local_840._0_4_;
                                uVar206 = local_840._4_4_;
                                uVar227 = local_840._8_4_;
                                uVar228 = local_840._12_4_;
                              }
                              if (*local_7c0.valid == 0) goto LAB_01d70b53;
                            }
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_7c0.hit;
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_7c0.hit + 4);
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_7c0.hit + 8);
                            *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc)
                            ;
                            *(float *)((long)local_7c0.ray + 0x40) =
                                 *(float *)(local_7c0.hit + 0x10);
                            *(float *)((long)local_7c0.ray + 0x44) =
                                 *(float *)(local_7c0.hit + 0x14);
                            *(float *)((long)local_7c0.ray + 0x48) =
                                 *(float *)(local_7c0.hit + 0x18);
                            *(float *)((long)local_7c0.ray + 0x4c) =
                                 *(float *)(local_7c0.hit + 0x1c);
                            *(float *)((long)local_7c0.ray + 0x50) =
                                 *(float *)(local_7c0.hit + 0x20);
                          }
                          else {
                            (*pGVar5->intersectionFilterN)(&local_7c0);
                            auVar205 = ZEXT464((uint)local_880._0_4_);
                            auVar225 = ZEXT1664(local_820._0_16_);
                            auVar234 = ZEXT1664(ZEXT816(0) << 0x40);
                            fVar135 = (float)local_840._0_4_;
                            uVar206 = local_840._4_4_;
                            uVar227 = local_840._8_4_;
                            uVar228 = local_840._12_4_;
                            if (*local_7c0.valid != 0) goto LAB_01d70aa3;
LAB_01d70b53:
                            (ray->super_RayK<1>).tfar = auVar205._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar76 = lVar75 != 0;
              lVar75 = lVar75 + -1;
            } while ((!bVar8) && (bVar76));
            auVar65._4_4_ = fStack_4fc;
            auVar65._0_4_ = local_500;
            auVar65._8_4_ = fStack_4f8;
            auVar65._12_4_ = fStack_4f4;
            auVar65._16_4_ = fStack_4f0;
            auVar65._20_4_ = fStack_4ec;
            auVar65._24_4_ = fStack_4e8;
            auVar65._28_4_ = fStack_4e4;
            fVar135 = (ray->super_RayK<1>).tfar;
            auVar39._4_4_ = fVar135;
            auVar39._0_4_ = fVar135;
            auVar39._8_4_ = fVar135;
            auVar39._12_4_ = fVar135;
            auVar39._16_4_ = fVar135;
            auVar39._20_4_ = fVar135;
            auVar39._24_4_ = fVar135;
            auVar39._28_4_ = fVar135;
            uVar16 = vcmpps_avx512vl(auVar65,auVar39,2);
            bVar74 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar74 & (byte)uVar16;
          } while (bVar74 != 0);
        }
        uVar17 = vpcmpd_avx512vl(local_4a0,_local_580,1);
        uVar18 = vpcmpd_avx512vl(local_4a0,local_3e0,1);
        auVar174._0_4_ = (float)local_5a0._0_4_ + (float)local_460._0_4_;
        auVar174._4_4_ = (float)local_5a0._4_4_ + (float)local_460._4_4_;
        auVar174._8_4_ = fStack_598 + fStack_458;
        auVar174._12_4_ = fStack_594 + fStack_454;
        auVar174._16_4_ = fStack_590 + fStack_450;
        auVar174._20_4_ = fStack_58c + fStack_44c;
        auVar174._24_4_ = fStack_588 + fStack_448;
        auVar174._28_4_ = fStack_584 + fStack_444;
        fVar211 = (ray->super_RayK<1>).tfar;
        auVar190._4_4_ = fVar211;
        auVar190._0_4_ = fVar211;
        auVar190._8_4_ = fVar211;
        auVar190._12_4_ = fVar211;
        auVar190._16_4_ = fVar211;
        auVar190._20_4_ = fVar211;
        auVar190._24_4_ = fVar211;
        auVar190._28_4_ = fVar211;
        uVar16 = vcmpps_avx512vl(auVar174,auVar190,2);
        bVar74 = (byte)local_788 & (byte)uVar18 & (byte)uVar16;
        auVar194._0_4_ = (float)local_5a0._0_4_ + (float)local_420._0_4_;
        auVar194._4_4_ = (float)local_5a0._4_4_ + (float)local_420._4_4_;
        auVar194._8_4_ = fStack_598 + fStack_418;
        auVar194._12_4_ = fStack_594 + fStack_414;
        auVar194._16_4_ = fStack_590 + fStack_410;
        auVar194._20_4_ = fStack_58c + fStack_40c;
        auVar194._24_4_ = fStack_588 + fStack_408;
        auVar194._28_4_ = fStack_584 + fStack_404;
        uVar16 = vcmpps_avx512vl(auVar194,auVar190,2);
        bVar69 = bVar69 & (byte)uVar17 & (byte)uVar16 | bVar74;
        prim = local_738;
        if (bVar69 != 0) {
          uVar77 = local_7c8 & 0xffffffff;
          abStack_180[uVar77 * 0x60] = bVar69;
          auVar93._0_4_ =
               (uint)(bVar74 & 1) * local_460._0_4_ | (uint)!(bool)(bVar74 & 1) * local_420._0_4_;
          bVar8 = (bool)(bVar74 >> 1 & 1);
          auVar93._4_4_ = (uint)bVar8 * local_460._4_4_ | (uint)!bVar8 * local_420._4_4_;
          bVar8 = (bool)(bVar74 >> 2 & 1);
          auVar93._8_4_ = (uint)bVar8 * (int)fStack_458 | (uint)!bVar8 * (int)fStack_418;
          bVar8 = (bool)(bVar74 >> 3 & 1);
          auVar93._12_4_ = (uint)bVar8 * (int)fStack_454 | (uint)!bVar8 * (int)fStack_414;
          bVar8 = (bool)(bVar74 >> 4 & 1);
          auVar93._16_4_ = (uint)bVar8 * (int)fStack_450 | (uint)!bVar8 * (int)fStack_410;
          bVar8 = (bool)(bVar74 >> 5 & 1);
          auVar93._20_4_ = (uint)bVar8 * (int)fStack_44c | (uint)!bVar8 * (int)fStack_40c;
          bVar8 = (bool)(bVar74 >> 6 & 1);
          auVar93._24_4_ = (uint)bVar8 * (int)fStack_448 | (uint)!bVar8 * (int)fStack_408;
          auVar93._28_4_ =
               (uint)(bVar74 >> 7) * (int)fStack_444 | (uint)!(bool)(bVar74 >> 7) * (int)fStack_404;
          *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x60) = auVar93;
          uVar16 = vmovlps_avx(local_780);
          *(undefined8 *)(afStack_140 + uVar77 * 0x18) = uVar16;
          auStack_138[uVar77 * 0x18] = (int)local_730 + 1;
          local_7c8 = (ulong)((int)local_7c8 + 1);
        }
      }
    }
    auVar195 = ZEXT1664(local_780);
    fVar211 = (ray->super_RayK<1>).tfar;
    auVar147._4_4_ = fVar211;
    auVar147._0_4_ = fVar211;
    auVar147._8_4_ = fVar211;
    auVar147._12_4_ = fVar211;
    auVar147._16_4_ = fVar211;
    auVar147._20_4_ = fVar211;
    auVar147._24_4_ = fVar211;
    auVar147._28_4_ = fVar211;
    local_7c8 = local_7c8 & 0xffffffff;
    do {
      if ((int)local_7c8 == 0) {
        fVar211 = (ray->super_RayK<1>).tfar;
        auVar40._4_4_ = fVar211;
        auVar40._0_4_ = fVar211;
        auVar40._8_4_ = fVar211;
        auVar40._12_4_ = fVar211;
        auVar40._16_4_ = fVar211;
        auVar40._20_4_ = fVar211;
        auVar40._24_4_ = fVar211;
        auVar40._28_4_ = fVar211;
        uVar16 = vcmpps_avx512vl(local_3c0,auVar40,2);
        uVar78 = (uint)uVar16 & (uint)local_728 - 1 & (uint)local_728;
        local_728 = (ulong)uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01d6e96e;
      }
      uVar77 = (ulong)((int)local_7c8 - 1);
      lVar75 = uVar77 * 0x60;
      auVar95 = *(undefined1 (*) [32])(auStack_160 + lVar75);
      auVar120._0_4_ = auVar95._0_4_ + (float)local_5a0._0_4_;
      auVar120._4_4_ = auVar95._4_4_ + (float)local_5a0._4_4_;
      auVar120._8_4_ = auVar95._8_4_ + fStack_598;
      auVar120._12_4_ = auVar95._12_4_ + fStack_594;
      auVar120._16_4_ = auVar95._16_4_ + fStack_590;
      auVar120._20_4_ = auVar95._20_4_ + fStack_58c;
      auVar120._24_4_ = auVar95._24_4_ + fStack_588;
      auVar120._28_4_ = auVar95._28_4_ + fStack_584;
      uVar16 = vcmpps_avx512vl(auVar120,auVar147,2);
      uVar78 = (uint)uVar16 & (uint)abStack_180[lVar75];
      bVar69 = (byte)uVar78;
      if (uVar78 != 0) {
        auVar188._8_4_ = 0x7f800000;
        auVar188._0_8_ = 0x7f8000007f800000;
        auVar188._12_4_ = 0x7f800000;
        auVar188._16_4_ = 0x7f800000;
        auVar188._20_4_ = 0x7f800000;
        auVar188._24_4_ = 0x7f800000;
        auVar188._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar188,auVar95);
        auVar93._0_4_ =
             (uint)(bVar69 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar95._0_4_;
        bVar8 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar93._4_4_ = (uint)bVar8 * auVar96._4_4_ | (uint)!bVar8 * (int)auVar95._4_4_;
        bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar93._8_4_ = (uint)bVar8 * auVar96._8_4_ | (uint)!bVar8 * (int)auVar95._8_4_;
        bVar8 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar93._12_4_ = (uint)bVar8 * auVar96._12_4_ | (uint)!bVar8 * (int)auVar95._12_4_;
        bVar8 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar93._16_4_ = (uint)bVar8 * auVar96._16_4_ | (uint)!bVar8 * (int)auVar95._16_4_;
        bVar8 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar93._20_4_ = (uint)bVar8 * auVar96._20_4_ | (uint)!bVar8 * (int)auVar95._20_4_;
        bVar8 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar93._24_4_ = (uint)bVar8 * auVar96._24_4_ | (uint)!bVar8 * (int)auVar95._24_4_;
        auVar93._28_4_ =
             (uVar78 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar78 >> 7,0) * (int)auVar95._28_4_;
        auVar95 = vshufps_avx(auVar93,auVar93,0xb1);
        auVar95 = vminps_avx(auVar93,auVar95);
        auVar96 = vshufpd_avx(auVar95,auVar95,5);
        auVar95 = vminps_avx(auVar95,auVar96);
        auVar96 = vpermpd_avx2(auVar95,0x4e);
        auVar95 = vminps_avx(auVar95,auVar96);
        uVar16 = vcmpps_avx512vl(auVar93,auVar95,0);
        bVar74 = (byte)uVar16 & bVar69;
        if (bVar74 != 0) {
          uVar78 = (uint)bVar74;
        }
        fVar211 = afStack_140[uVar77 * 0x18 + 1];
        uVar128 = 0;
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
          uVar128 = uVar128 + 1;
        }
        local_730 = (ulong)auStack_138[uVar77 * 0x18];
        bVar74 = ~('\x01' << ((byte)uVar128 & 0x1f)) & bVar69;
        abStack_180[lVar75] = bVar74;
        uVar71 = uVar77;
        if (bVar74 != 0) {
          uVar71 = local_7c8;
        }
        fVar135 = afStack_140[uVar77 * 0x18];
        auVar120._4_4_ = fVar135;
        auVar120._0_4_ = fVar135;
        auVar120._8_4_ = fVar135;
        auVar120._12_4_ = fVar135;
        auVar120._16_4_ = fVar135;
        auVar120._20_4_ = fVar135;
        auVar120._24_4_ = fVar135;
        auVar120._28_4_ = fVar135;
        fVar211 = fVar211 - fVar135;
        auVar173._4_4_ = fVar211;
        auVar173._0_4_ = fVar211;
        auVar173._8_4_ = fVar211;
        auVar173._12_4_ = fVar211;
        auVar173._16_4_ = fVar211;
        auVar173._20_4_ = fVar211;
        auVar173._24_4_ = fVar211;
        auVar173._28_4_ = fVar211;
        auVar80 = vfmadd132ps_fma(auVar173,auVar120,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar80);
        auVar195 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar128 * 4));
        uVar77 = uVar71;
      }
      local_7c8 = uVar77;
    } while (bVar69 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }